

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  short sVar3;
  stbi__uint32 sVar4;
  uint *puVar5;
  bool bVar6;
  undefined1 auVar7 [8];
  stbi_uc sVar8;
  byte bVar9;
  char cVar10;
  uchar uVar11;
  byte bVar12;
  int iVar13;
  stbi__gif_lzw sVar14;
  stbi__gif_lzw sVar15;
  stbi__gif_lzw sVar16;
  stbi__gif_lzw sVar17;
  uint uVar18;
  stbi__gif_lzw sVar19;
  int iVar20;
  stbi__gif_lzw sVar21;
  stbi__gif_lzw sVar22;
  stbi__gif_lzw sVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  stbi__gif *g;
  long lVar28;
  char *pcVar29;
  uchar *puVar30;
  uchar *puVar31;
  void *pvVar32;
  code *pcVar33;
  stbi__context *data;
  undefined8 uVar34;
  stbi_uc *psVar35;
  float *data_00;
  stbi_uc *psVar36;
  byte *pbVar37;
  byte bVar38;
  int iVar39;
  uint uVar40;
  long lVar41;
  undefined1 uVar42;
  stbi__gif_lzw sVar43;
  uint uVar44;
  ulong uVar46;
  uint uVar47;
  stbi__gif_lzw sVar48;
  ulong uVar49;
  int *piVar50;
  stbi_uc *psVar51;
  size_t __size;
  stbi__context *psVar52;
  uint uVar53;
  anon_struct_96_18_0d0905d3 *unaff_RBP;
  anon_struct_96_18_0d0905d3 *paVar54;
  stbi__gif_lzw sVar55;
  short *psVar56;
  stbi__uint32 sVar57;
  ulong uVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  int iVar62;
  stbi__gif_lzw *psVar63;
  short sVar64;
  uint uVar65;
  uint uVar66;
  stbi_uc (*pal) [4];
  bool bVar67;
  bool bVar68;
  stbi_uc *coutput [4];
  stbi__jpeg j;
  stbi__context *local_48a0;
  stbi__gif_lzw local_4880;
  uint local_4868;
  uint local_4860;
  uint local_4850;
  int local_4814;
  uint local_47f4;
  stbi__bmp_data local_47e8;
  int local_47c8;
  int local_47c4;
  stbi_uc *local_47c0;
  undefined1 local_47b8 [8];
  stbi_uc *local_47b0 [2];
  undefined8 local_47a0;
  int local_4798 [4546];
  uchar local_90;
  code *local_50;
  code *local_48;
  code *local_40;
  int iVar45;
  
  local_50 = stbi__idct_block;
  local_48 = stbi__YCbCr_to_RGB_row;
  local_40 = stbi__resample_row_hv_2;
  local_90 = 0xff;
  local_47b8 = (undefined1  [8])s;
  sVar8 = stbi__get_marker((stbi__jpeg *)local_47b8);
  if (sVar8 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar8 == 0xd8) {
    g = (stbi__gif *)malloc(0x4780);
    *(stbi__context **)g = s;
    *(code **)(g->codes + 0xfce) = stbi__idct_block;
    *(code **)(g->codes + 0xfd0) = stbi__YCbCr_to_RGB_row;
    *(code **)(g->codes + 0xfd2) = stbi__resample_row_hv_2;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = (anon_struct_96_18_0d0905d3 *)(g->codes + 0xf5c);
      lVar28 = 0x45d8;
      do {
        puVar2 = (undefined8 *)((long)&((stbi__gif *)(g->pal + -0xc))->w + lVar28);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar28 = lVar28 + 0x60;
      } while (lVar28 != 0x4758);
      g->codes[0xfcc].prefix = 0;
      g->codes[0xfcc].first = '\0';
      g->codes[0xfcc].suffix = '\0';
      iVar13 = stbi__decode_jpeg_header((stbi__jpeg *)g,0);
      if (iVar13 != 0) {
        bVar9 = stbi__get_marker((stbi__jpeg *)g);
        do {
          if (bVar9 == 0xda) {
            iVar13 = stbi__get16be(*(stbi__context **)g);
            lVar28 = *(long *)g;
            pbVar37 = *(byte **)(lVar28 + 0xb8);
            if (pbVar37 < *(byte **)(lVar28 + 0xc0)) {
LAB_00126cd1:
              *(byte **)(lVar28 + 0xb8) = pbVar37 + 1;
              bVar9 = *pbVar37;
            }
            else {
              if (*(int *)(lVar28 + 0x30) != 0) {
                lVar41 = lVar28 + 0x38;
                iVar62 = (**(code **)(lVar28 + 0x10))
                                   (*(undefined8 *)(lVar28 + 0x28),lVar41,
                                    *(undefined4 *)(lVar28 + 0x34));
                if (iVar62 == 0) {
                  *(undefined4 *)(lVar28 + 0x30) = 0;
                  *(long *)(lVar28 + 0xb8) = lVar41;
                  *(long *)(lVar28 + 0xc0) = lVar28 + 0x39;
                  *(undefined1 *)(lVar28 + 0x38) = 0;
                }
                else {
                  *(long *)(lVar28 + 0xb8) = lVar41;
                  *(long *)(lVar28 + 0xc0) = iVar62 + lVar41;
                }
                pbVar37 = *(byte **)(lVar28 + 0xb8);
                goto LAB_00126cd1;
              }
              bVar9 = 0;
            }
            sVar14._1_3_ = 0;
            sVar14.prefix._0_1_ = bVar9;
            g->codes[0xfc7] = sVar14;
            if (((byte)(bVar9 - 5) < 0xfc) || (*(int *)(*(long *)g + 8) < (int)(uint)bVar9)) {
              stbi__g_failure_reason = "bad SOS component count";
              break;
            }
            if (iVar13 != (uint)bVar9 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              break;
            }
            if (bVar9 != 0) {
              lVar28 = 0;
              do {
                lVar41 = *(long *)g;
                pbVar37 = *(byte **)(lVar41 + 0xb8);
                if (pbVar37 < *(byte **)(lVar41 + 0xc0)) {
LAB_00126d8e:
                  *(byte **)(lVar41 + 0xb8) = pbVar37 + 1;
                  unaff_RBP = (anon_struct_96_18_0d0905d3 *)(ulong)*pbVar37;
                }
                else {
                  if (*(int *)(lVar41 + 0x30) != 0) {
                    lVar60 = lVar41 + 0x38;
                    iVar13 = (**(code **)(lVar41 + 0x10))
                                       (*(undefined8 *)(lVar41 + 0x28),lVar60,
                                        *(undefined4 *)(lVar41 + 0x34));
                    if (iVar13 == 0) {
                      *(undefined4 *)(lVar41 + 0x30) = 0;
                      *(long *)(lVar41 + 0xb8) = lVar60;
                      *(long *)(lVar41 + 0xc0) = lVar41 + 0x39;
                      *(undefined1 *)(lVar41 + 0x38) = 0;
                    }
                    else {
                      *(long *)(lVar41 + 0xb8) = lVar60;
                      *(long *)(lVar41 + 0xc0) = iVar13 + lVar60;
                    }
                    pbVar37 = *(byte **)(lVar41 + 0xb8);
                    goto LAB_00126d8e;
                  }
                  unaff_RBP = (anon_struct_96_18_0d0905d3 *)0x0;
                }
                lVar41 = *(long *)g;
                pbVar37 = *(byte **)(lVar41 + 0xb8);
                if (pbVar37 < *(byte **)(lVar41 + 0xc0)) {
LAB_00126e11:
                  *(byte **)(lVar41 + 0xb8) = pbVar37 + 1;
                  bVar9 = *pbVar37;
                }
                else {
                  if (*(int *)(lVar41 + 0x30) != 0) {
                    lVar60 = lVar41 + 0x38;
                    iVar13 = (**(code **)(lVar41 + 0x10))
                                       (*(undefined8 *)(lVar41 + 0x28),lVar60,
                                        *(undefined4 *)(lVar41 + 0x34));
                    if (iVar13 == 0) {
                      *(undefined4 *)(lVar41 + 0x30) = 0;
                      *(long *)(lVar41 + 0xb8) = lVar60;
                      *(long *)(lVar41 + 0xc0) = lVar41 + 0x39;
                      *(undefined1 *)(lVar41 + 0x38) = 0;
                    }
                    else {
                      *(long *)(lVar41 + 0xb8) = lVar60;
                      *(long *)(lVar41 + 0xc0) = iVar13 + lVar60;
                    }
                    pbVar37 = *(byte **)(lVar41 + 0xb8);
                    goto LAB_00126e11;
                  }
                  bVar9 = 0;
                }
                sVar14 = *(stbi__gif_lzw *)(*(long *)g + 8);
                if ((int)sVar14 < 1) {
                  uVar49 = 0;
                }
                else {
                  uVar49 = 0;
                  paVar54 = paVar1;
                  do {
                    if (paVar54->id == (int)unaff_RBP) goto LAB_00126e43;
                    uVar49 = uVar49 + 1;
                    paVar54 = paVar54 + 1;
                  } while ((uint)sVar14 != uVar49);
                  uVar49 = (ulong)(uint)sVar14;
                }
LAB_00126e43:
                if (SUB84(uVar49,0) == sVar14) goto LAB_00128ef3;
                sVar55._1_3_ = 0;
                sVar55.prefix._0_1_ = bVar9 >> 4;
                g->codes[(uVar49 & 0xffffffff) * 0x18 + 0xf60] = sVar55;
                if (0x3f < bVar9) {
                  stbi__g_failure_reason = "bad DC huff";
                  goto LAB_00128ef3;
                }
                paVar1[uVar49 & 0xffffffff].ha = bVar9 & 0xf;
                if (3 < (bVar9 & 0xf)) {
                  stbi__g_failure_reason = "bad AC huff";
                  goto LAB_00128ef3;
                }
                g->codes[lVar28 + 0xfc8] = SUB84(uVar49,0);
                lVar28 = lVar28 + 1;
              } while (lVar28 < (int)g->codes[0xfc7]);
            }
            lVar28 = *(long *)g;
            pbVar37 = *(byte **)(lVar28 + 0xb8);
            if (pbVar37 < *(byte **)(lVar28 + 0xc0)) {
LAB_00126f0d:
              *(byte **)(lVar28 + 0xb8) = pbVar37 + 1;
              sVar15._1_3_ = 0;
              sVar15.prefix._0_1_ = *pbVar37;
            }
            else {
              if (*(int *)(lVar28 + 0x30) != 0) {
                lVar41 = lVar28 + 0x38;
                iVar13 = (**(code **)(lVar28 + 0x10))
                                   (*(undefined8 *)(lVar28 + 0x28),lVar41,
                                    *(undefined4 *)(lVar28 + 0x34));
                if (iVar13 == 0) {
                  *(undefined4 *)(lVar28 + 0x30) = 0;
                  *(long *)(lVar28 + 0xb8) = lVar41;
                  *(long *)(lVar28 + 0xc0) = lVar28 + 0x39;
                  *(undefined1 *)(lVar28 + 0x38) = 0;
                }
                else {
                  *(long *)(lVar28 + 0xb8) = lVar41;
                  *(long *)(lVar28 + 0xc0) = iVar13 + lVar41;
                }
                pbVar37 = *(byte **)(lVar28 + 0xb8);
                goto LAB_00126f0d;
              }
              sVar15.prefix = 0;
              sVar15.first = '\0';
              sVar15.suffix = '\0';
            }
            g->codes[0xfc1] = sVar15;
            lVar28 = *(long *)g;
            pbVar37 = *(byte **)(lVar28 + 0xb8);
            if (pbVar37 < *(byte **)(lVar28 + 0xc0)) {
LAB_00126f96:
              *(byte **)(lVar28 + 0xb8) = pbVar37 + 1;
              sVar16._1_3_ = 0;
              sVar16.prefix._0_1_ = *pbVar37;
            }
            else {
              if (*(int *)(lVar28 + 0x30) != 0) {
                lVar41 = lVar28 + 0x38;
                iVar13 = (**(code **)(lVar28 + 0x10))
                                   (*(undefined8 *)(lVar28 + 0x28),lVar41,
                                    *(undefined4 *)(lVar28 + 0x34));
                if (iVar13 == 0) {
                  *(undefined4 *)(lVar28 + 0x30) = 0;
                  *(long *)(lVar28 + 0xb8) = lVar41;
                  *(long *)(lVar28 + 0xc0) = lVar28 + 0x39;
                  *(undefined1 *)(lVar28 + 0x38) = 0;
                }
                else {
                  *(long *)(lVar28 + 0xb8) = lVar41;
                  *(long *)(lVar28 + 0xc0) = iVar13 + lVar41;
                }
                pbVar37 = *(byte **)(lVar28 + 0xb8);
                goto LAB_00126f96;
              }
              sVar16.prefix = 0;
              sVar16.first = '\0';
              sVar16.suffix = '\0';
            }
            g->codes[0xfc2] = sVar16;
            lVar28 = *(long *)g;
            pbVar37 = *(byte **)(lVar28 + 0xb8);
            if (pbVar37 < *(byte **)(lVar28 + 0xc0)) {
LAB_0012701f:
              *(byte **)(lVar28 + 0xb8) = pbVar37 + 1;
              bVar9 = *pbVar37;
            }
            else {
              if (*(int *)(lVar28 + 0x30) != 0) {
                lVar41 = lVar28 + 0x38;
                iVar13 = (**(code **)(lVar28 + 0x10))
                                   (*(undefined8 *)(lVar28 + 0x28),lVar41,
                                    *(undefined4 *)(lVar28 + 0x34));
                if (iVar13 == 0) {
                  *(undefined4 *)(lVar28 + 0x30) = 0;
                  *(long *)(lVar28 + 0xb8) = lVar41;
                  *(long *)(lVar28 + 0xc0) = lVar28 + 0x39;
                  *(undefined1 *)(lVar28 + 0x38) = 0;
                }
                else {
                  *(long *)(lVar28 + 0xb8) = lVar41;
                  *(long *)(lVar28 + 0xc0) = iVar13 + lVar41;
                }
                pbVar37 = *(byte **)(lVar28 + 0xb8);
                goto LAB_0012701f;
              }
              bVar9 = 0;
            }
            sVar17._1_3_ = 0;
            sVar17.prefix._0_1_ = bVar9 >> 4;
            g->codes[0xfc3] = sVar17;
            g->codes[0xfc4] = (stbi__gif_lzw)(bVar9 & 0xf);
            sVar14 = g->codes[0xfc0];
            sVar55 = g->codes[0xfc1];
            if (sVar14 == (stbi__gif_lzw)0x0) {
              if ((sVar55 != (stbi__gif_lzw)0x0) || ((0xf < bVar9 || ((bVar9 & 0xf) != 0)))) {
LAB_001289a6:
                stbi__g_failure_reason = "bad SOS";
                break;
              }
              g->codes[0xfc2].prefix = 0x3f;
              g->codes[0xfc2].first = '\0';
              g->codes[0xfc2].suffix = '\0';
            }
            else if ((((0x3f < (int)sVar55) || (0x3f < (int)g->codes[0xfc2])) ||
                     ((int)g->codes[0xfc2] < (int)sVar55)) ||
                    ((0xdf < bVar9 || (0xd < (bVar9 & 0xf))))) goto LAB_001289a6;
            sVar55 = g->codes[0xfc7];
            sVar43 = g->codes[0xfcc];
            if (sVar43 == (stbi__gif_lzw)0x0) {
              sVar43.prefix = -1;
              sVar43.first = 0xff;
              sVar43.suffix = '\x7f';
            }
            g->codes[0xfbc].prefix = 0;
            g->codes[0xfbc].first = '\0';
            g->codes[0xfbc].suffix = '\0';
            g->codes[0xfbd].prefix = 0;
            g->codes[0xfbd].first = '\0';
            g->codes[0xfbd].suffix = '\0';
            g->codes[0xfbf].prefix = 0;
            g->codes[0xfbf].first = '\0';
            g->codes[0xfbf].suffix = '\0';
            g->codes[0xf92].prefix = 0;
            g->codes[0xf92].first = '\0';
            g->codes[0xf92].suffix = '\0';
            g->codes[0xf7a].prefix = 0;
            g->codes[0xf7a].first = '\0';
            g->codes[0xf7a].suffix = '\0';
            g->codes[0xf62].prefix = 0;
            g->codes[0xf62].first = '\0';
            g->codes[0xf62].suffix = '\0';
            *(uchar *)&g->codes[0xfbe].prefix = 0xff;
            g->codes[0xfcd] = sVar43;
            g->codes[0xfc5].prefix = 0;
            g->codes[0xfc5].first = '\0';
            g->codes[0xfc5].suffix = '\0';
            if (sVar14 == (stbi__gif_lzw)0x0) {
              if (sVar55 == (stbi__gif_lzw)0x1) {
                sVar14 = g->codes[0xfc8];
                lVar28 = (long)(int)sVar14;
                iVar13 = (int)g->codes[lVar28 * 0x18 + 0xf64] + 7 >> 3;
                sVar48.prefix = 1;
                sVar48.first = '\0';
                sVar48.suffix = '\0';
                if (0 < iVar13) {
                  uVar65 = paVar1[lVar28].x + 7 >> 3;
                  iVar24 = 0;
                  iVar62 = 0;
                  do {
                    sVar48 = local_4880;
                    local_4880 = sVar48;
                    if (0 < (int)uVar65) {
                      unaff_RBP = (anon_struct_96_18_0d0905d3 *)0x0;
                      do {
                        iVar39 = stbi__jpeg_decode_block
                                           ((stbi__jpeg *)g,(short *)local_47b8,
                                            (stbi__huffman *)
                                            (g->pal + (long)paVar1[lVar28].hd * 0x1a4 + -10),
                                            (stbi__huffman *)
                                            (g->codes + (long)paVar1[lVar28].ha * 0x1a4 + 0x486),
                                            &g->codes[(long)paVar1[lVar28].ha * 0x100 + 0xb56].
                                             prefix,(int)sVar14,
                                            (stbi_uc *)
                                            (g->codes + (long)paVar1[lVar28].tq * 0x10 + 0xb16));
                        if (iVar39 == 0) {
                          bVar68 = false;
                          sVar48.prefix = 0;
                          sVar48.first = '\0';
                          sVar48.suffix = '\0';
                        }
                        else {
                          (**(_func_void_stbi_uc_ptr_int_short_ptr **)(g->codes + 0xfce))
                                    (paVar1[lVar28].data + iVar24 * paVar1[lVar28].w2 +
                                     (long)unaff_RBP,paVar1[lVar28].w2,(short *)local_47b8);
                          sVar55 = g->codes[0xfcd];
                          g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar55 + -1);
                          bVar68 = true;
                          if ((int)sVar55 < 2) {
                            if ((int)g->codes[0xfbd] < 0x18) {
                              stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                            }
                            if ((g->codes[0xfbe].prefix & 0xf8) == 0xd0) {
                              g->codes[0xfbc].prefix = 0;
                              g->codes[0xfbc].first = '\0';
                              g->codes[0xfbc].suffix = '\0';
                              g->codes[0xfbd].prefix = 0;
                              g->codes[0xfbd].first = '\0';
                              g->codes[0xfbd].suffix = '\0';
                              g->codes[0xfbf].prefix = 0;
                              g->codes[0xfbf].first = '\0';
                              g->codes[0xfbf].suffix = '\0';
                              g->codes[0xf92].prefix = 0;
                              g->codes[0xf92].first = '\0';
                              g->codes[0xf92].suffix = '\0';
                              g->codes[0xf7a].prefix = 0;
                              g->codes[0xf7a].first = '\0';
                              g->codes[0xf7a].suffix = '\0';
                              g->codes[0xf62].prefix = 0;
                              g->codes[0xf62].first = '\0';
                              g->codes[0xf62].suffix = '\0';
                              *(uchar *)&g->codes[0xfbe].prefix = 0xff;
                              sVar21 = g->codes[0xfcc];
                              if (sVar21 == (stbi__gif_lzw)0x0) {
                                sVar21.prefix = -1;
                                sVar21.first = 0xff;
                                sVar21.suffix = '\x7f';
                              }
                              g->codes[0xfcd] = sVar21;
                              g->codes[0xfc5].prefix = 0;
                              g->codes[0xfc5].first = '\0';
                              g->codes[0xfc5].suffix = '\0';
                            }
                            else {
                              sVar48.prefix = 1;
                              sVar48.first = '\0';
                              sVar48.suffix = '\0';
                              bVar68 = false;
                            }
                          }
                        }
                        local_4880 = sVar48;
                        if (!bVar68) goto LAB_0012800e;
                        unaff_RBP = (anon_struct_96_18_0d0905d3 *)&unaff_RBP->v;
                      } while ((anon_struct_96_18_0d0905d3 *)((ulong)uVar65 * 8) != unaff_RBP);
                    }
                    sVar48.prefix = 1;
                    sVar48.first = '\0';
                    sVar48.suffix = '\0';
                    iVar62 = iVar62 + 1;
                    iVar24 = iVar24 + 8;
                  } while (iVar62 != iVar13);
                }
              }
              else {
                sVar48.prefix = 1;
                sVar48.first = '\0';
                sVar48.suffix = '\0';
                if (0 < (int)g->codes[0xf59]) {
                  iVar13 = 0;
                  do {
                    if (0 < (int)g->codes[0xf58]) {
                      local_4880.prefix = 0;
                      local_4880.first = '\0';
                      local_4880.suffix = '\0';
                      do {
                        if (0 < (int)g->codes[0xfc7]) {
                          lVar28 = 0;
                          do {
                            sVar14 = g->codes[lVar28 + 0xfc8];
                            lVar41 = (long)(int)sVar14;
                            unaff_RBP = (anon_struct_96_18_0d0905d3 *)(lVar41 * 0x60);
                            if (0 < (int)(g->codes + 0xf5e)[lVar41 * 0x18]) {
                              unaff_RBP = paVar1 + lVar41;
                              iVar62 = 0;
                              bVar68 = true;
                              do {
                                iVar24 = unaff_RBP->h;
                                if (0 < iVar24) {
                                  iVar39 = 0;
                                  do {
                                    iVar25 = unaff_RBP->v;
                                    iVar20 = stbi__jpeg_decode_block
                                                       ((stbi__jpeg *)g,(short *)local_47b8,
                                                        (stbi__huffman *)
                                                        (g->pal + (long)unaff_RBP->hd * 0x1a4 + -10)
                                                        ,(stbi__huffman *)
                                                         (g->codes +
                                                         (long)unaff_RBP->ha * 0x1a4 + 0x486),
                                                        &g->codes[(long)unaff_RBP->ha * 0x100 +
                                                                  0xb56].prefix,(int)sVar14,
                                                        (stbi_uc *)
                                                        (g->codes +
                                                        (long)unaff_RBP->tq * 0x10 + 0xb16));
                                    if (iVar20 == 0) {
                                      if (!bVar68) goto LAB_00127f26;
                                      goto LAB_00127ffd;
                                    }
                                    (**(_func_void_stbi_uc_ptr_int_short_ptr **)(g->codes + 0xfce))
                                              (unaff_RBP->data +
                                               (long)((iVar24 * (int)local_4880 + iVar39) * 8) +
                                               (long)((iVar25 * iVar13 + iVar62) * unaff_RBP->w2 * 8
                                                     ),unaff_RBP->w2,(short *)local_47b8);
                                    iVar39 = iVar39 + 1;
                                    iVar24 = unaff_RBP->h;
                                  } while (iVar39 < iVar24);
                                }
                                iVar62 = iVar62 + 1;
                                bVar68 = iVar62 < unaff_RBP->v;
                              } while (iVar62 < unaff_RBP->v);
                            }
LAB_00127f26:
                            lVar28 = lVar28 + 1;
                          } while (lVar28 < (int)g->codes[0xfc7]);
                        }
                        sVar14 = g->codes[0xfcd];
                        g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar14 + -1);
                        sVar48.prefix = 1;
                        sVar48.first = '\0';
                        sVar48.suffix = '\0';
                        if ((int)sVar14 < 2) {
                          if ((int)g->codes[0xfbd] < 0x18) {
                            stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                          }
                          if ((g->codes[0xfbe].prefix & 0xf8) != 0xd0) goto LAB_0012800e;
                          g->codes[0xfbc].prefix = 0;
                          g->codes[0xfbc].first = '\0';
                          g->codes[0xfbc].suffix = '\0';
                          g->codes[0xfbd].prefix = 0;
                          g->codes[0xfbd].first = '\0';
                          g->codes[0xfbd].suffix = '\0';
                          g->codes[0xfbf].prefix = 0;
                          g->codes[0xfbf].first = '\0';
                          g->codes[0xfbf].suffix = '\0';
                          g->codes[0xf92].prefix = 0;
                          g->codes[0xf92].first = '\0';
                          g->codes[0xf92].suffix = '\0';
                          g->codes[0xf7a].prefix = 0;
                          g->codes[0xf7a].first = '\0';
                          g->codes[0xf7a].suffix = '\0';
                          g->codes[0xf62].prefix = 0;
                          g->codes[0xf62].first = '\0';
                          g->codes[0xf62].suffix = '\0';
                          *(uchar *)&g->codes[0xfbe].prefix = 0xff;
                          sVar23 = g->codes[0xfcc];
                          if (sVar23 == (stbi__gif_lzw)0x0) {
                            sVar23.prefix = -1;
                            sVar23.first = 0xff;
                            sVar23.suffix = '\x7f';
                          }
                          g->codes[0xfcd] = sVar23;
                          g->codes[0xfc5].prefix = 0;
                          g->codes[0xfc5].first = '\0';
                          g->codes[0xfc5].suffix = '\0';
                        }
                        local_4880 = (stbi__gif_lzw)((int)local_4880 + 1);
                      } while ((int)local_4880 < (int)g->codes[0xf58]);
                    }
                    sVar48.prefix = 1;
                    sVar48.first = '\0';
                    sVar48.suffix = '\0';
                    iVar13 = iVar13 + 1;
                  } while (iVar13 < (int)g->codes[0xf59]);
                }
              }
            }
            else if (sVar55 == (stbi__gif_lzw)0x1) {
              sVar14 = g->codes[0xfc8];
              lVar28 = (long)(int)sVar14;
              iVar13 = (int)g->codes[lVar28 * 0x18 + 0xf64] + 7 >> 3;
              sVar48.prefix = 1;
              sVar48.first = '\0';
              sVar48.suffix = '\0';
              if (0 < iVar13) {
                iVar24 = (int)g->codes[lVar28 * 0x18 + 0xf63] + 7 >> 3;
                iVar62 = 0;
                do {
                  if (0 < iVar24) {
                    iVar39 = 0;
                    paVar54 = unaff_RBP;
                    do {
                      psVar56 = paVar1[lVar28].coeff +
                                (paVar1[lVar28].coeff_w * iVar62 + iVar39) * 0x40;
                      uVar49 = (ulong)(int)g->codes[0xfc1];
                      if (uVar49 == 0) {
                        iVar25 = stbi__jpeg_decode_block_prog_dc
                                           ((stbi__jpeg *)g,psVar56,
                                            (stbi__huffman *)
                                            (g->pal + (long)paVar1[lVar28].hd * 0x1a4 + -10),
                                            (int)sVar14);
                        if (iVar25 != 0) goto LAB_0012763a;
                        bVar68 = false;
                        unaff_RBP = (anon_struct_96_18_0d0905d3 *)0x0;
                      }
                      else {
                        lVar41 = (long)paVar1[lVar28].ha;
                        local_4880 = g->codes[0xfc4];
                        sVar55 = g->codes[0xfc5];
                        bVar9 = (byte)local_4880.prefix;
                        if (g->codes[0xfc3] == (stbi__gif_lzw)0x0) {
                          if (sVar55 == (stbi__gif_lzw)0x0) {
                            do {
                              if ((int)g->codes[0xfbd] < 0x10) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                              }
                              sVar64 = (&g->codes[lVar41 * 0x100 + 0xb56].prefix)
                                       [(uint)g->codes[0xfbc] >> 0x17];
                              uVar65 = (uint)sVar64;
                              iVar25 = (int)uVar49;
                              if (sVar64 == 0) {
                                if ((int)g->codes[0xfbd] < 0x10) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                }
                                sVar55 = g->codes[0xfbc];
                                uVar46 = (ulong)*(byte *)((long)&g->codes[lVar41 * 0x1a4 + 0x486].
                                                                 prefix +
                                                         (ulong)((uint)sVar55 >> 0x17));
                                if (uVar46 == 0xff) {
                                  lVar60 = 0;
                                  do {
                                    lVar61 = lVar60;
                                    lVar60 = lVar61 + 1;
                                  } while ((uint)g->codes[lVar41 * 0x1a4 + lVar61 + 0x611] <=
                                           (uint)sVar55 >> 0x10);
                                  sVar15 = g->codes[0xfbd];
                                  if (lVar60 == 8) {
                                    g->codes[0xfbd] = (stbi__gif_lzw)((int)sVar15 + -0x10);
                                    uVar65 = 0xffffffff;
                                  }
                                  else {
                                    uVar65 = 0xffffffff;
                                    if ((int)(lVar61 + 10) <= (int)sVar15) {
                                      lVar59 = (long)(int)(((uint)sVar55 >>
                                                            (0x17U - (char)lVar60 & 0x1f) &
                                                           stbi__bmask[lVar61 + 10]) +
                                                          (int)g->codes[lVar41 * 0x1a4 +
                                                                        lVar61 + 0x623]);
                                      bVar38 = *(byte *)((long)&g->codes[lVar41 * 0x1a4 + 0x5c6].
                                                                prefix + lVar59);
                                      if (((uint)sVar55 >> (-bVar38 & 0x1f) & stbi__bmask[bVar38])
                                          != (uint)(ushort)(&g->codes[lVar41 * 0x1a4 + 0x506].prefix
                                                           )[lVar59]) goto LAB_0012ab0d;
                                      g->codes[0xfbd] =
                                           (stbi__gif_lzw)(((int)sVar15 - (int)lVar60) + -9);
                                      g->codes[0xfbc] =
                                           (stbi__gif_lzw)
                                           ((int)sVar55 << ((byte)(lVar61 + 10) & 0x1f));
                                      uVar65 = (uint)*(byte *)((long)&g->codes[lVar41 * 0x1a4 +
                                                                               0x586].prefix +
                                                              lVar59);
                                    }
                                  }
                                }
                                else {
                                  bVar38 = *(byte *)((long)&g->codes[lVar41 * 0x1a4 + 0x5c6].prefix
                                                    + uVar46);
                                  uVar65 = 0xffffffff;
                                  if ((int)(uint)bVar38 <= (int)g->codes[0xfbd]) {
                                    g->codes[0xfbc] =
                                         (stbi__gif_lzw)((int)sVar55 << (bVar38 & 0x1f));
                                    g->codes[0xfbd] =
                                         (stbi__gif_lzw)((int)g->codes[0xfbd] - (uint)bVar38);
                                    uVar65 = (uint)*(byte *)((long)&g->codes[lVar41 * 0x1a4 + 0x586]
                                                                    .prefix + uVar46);
                                  }
                                }
                                if ((int)uVar65 < 0) {
                                  stbi__g_failure_reason = "bad huffman code";
                                  iVar20 = 1;
                                }
                                else {
                                  uVar47 = uVar65 >> 4;
                                  uVar18 = uVar65 & 0xf;
                                  if (uVar18 != 0) {
                                    bVar38 = ""[(long)iVar25 + (ulong)uVar47];
                                    if ((int)g->codes[0xfbd] < (int)uVar18) {
                                      stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                    }
                                    sVar55 = g->codes[0xfbc];
                                    uVar44 = (int)sVar55 << (sbyte)uVar18 |
                                             (uint)sVar55 >> 0x20 - (sbyte)uVar18;
                                    uVar65 = *(uint *)((long)stbi__bmask + (ulong)(uVar18 * 4));
                                    g->codes[0xfbc] = (stbi__gif_lzw)(~uVar65 & uVar44);
                                    g->codes[0xfbd] = (stbi__gif_lzw)((int)g->codes[0xfbd] - uVar18)
                                    ;
                                    iVar20 = 0;
                                    iVar26 = 0;
                                    if (-1 < (int)sVar55) {
                                      iVar26 = *(int *)((long)stbi__jbias + (ulong)(uVar18 * 4));
                                    }
                                    uVar49 = (ulong)((int)((long)iVar25 + (ulong)uVar47) + 1);
                                    psVar56[bVar38] =
                                         (short)((uVar44 & uVar65) + iVar26 << (bVar9 & 0x1f));
                                    bVar68 = true;
                                    goto LAB_001279fb;
                                  }
                                  if (0xef < uVar65) {
                                    uVar47 = iVar25 + 0x10;
                                    goto LAB_00127775;
                                  }
                                  g->codes[0xfc5] = (stbi__gif_lzw)(1 << ((byte)uVar47 & 0x1f));
                                  if (0xf < uVar65) {
                                    if ((int)g->codes[0xfbd] < (int)uVar47) {
                                      stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                    }
                                    bVar38 = (byte)uVar47 & 0x1f;
                                    uVar18 = (int)g->codes[0xfbc] << bVar38 |
                                             (uint)g->codes[0xfbc] >> 0x20 - bVar38;
                                    uVar65 = stbi__bmask[uVar47];
                                    g->codes[0xfbc] = (stbi__gif_lzw)(~uVar65 & uVar18);
                                    g->codes[0xfbd] = (stbi__gif_lzw)((int)g->codes[0xfbd] - uVar47)
                                    ;
                                    g->codes[0xfc5] =
                                         (stbi__gif_lzw)((int)g->codes[0xfc5] + (uVar18 & uVar65));
                                  }
                                  g->codes[0xfc5] = (stbi__gif_lzw)((int)g->codes[0xfc5] + -1);
                                  iVar20 = 2;
                                }
                                bVar68 = false;
                              }
                              else {
                                g->codes[0xfbc] =
                                     (stbi__gif_lzw)((int)g->codes[0xfbc] << (sbyte)(uVar65 & 0xf));
                                g->codes[0xfbd] =
                                     (stbi__gif_lzw)((int)g->codes[0xfbd] - (uVar65 & 0xf));
                                lVar60 = (long)iVar25 + (ulong)(uVar65 >> 4 & 0xf);
                                uVar47 = (int)lVar60 + 1;
                                psVar56[""[lVar60]] = (short)((uVar65 >> 8) << (bVar9 & 0x1f));
LAB_00127775:
                                uVar49 = (ulong)uVar47;
                                iVar20 = 0;
                                bVar68 = true;
                              }
LAB_001279fb:
                              unaff_RBP = (anon_struct_96_18_0d0905d3 *)0x0;
                              bVar67 = true;
                              if (iVar20 != 0) {
                                if (iVar20 != 2) {
                                  bVar67 = bVar68;
                                }
                                break;
                              }
                            } while ((int)uVar49 <= (int)g->codes[0xfc2]);
                          }
                          else {
                            g->codes[0xfc5] = (stbi__gif_lzw)((int)sVar55 + -1);
                            unaff_RBP = (anon_struct_96_18_0d0905d3 *)0x1;
                            bVar67 = false;
                          }
                          if (bVar67) goto LAB_00127619;
                        }
                        else {
                          if (sVar55 == (stbi__gif_lzw)0x0) {
                            uVar65 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                            do {
                              if ((int)g->codes[0xfbd] < 0x10) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                              }
                              sVar55 = g->codes[0xfbc];
                              uVar46 = (ulong)*(byte *)((long)&g->codes[lVar41 * 0x1a4 + 0x486].
                                                               prefix +
                                                       (ulong)((uint)sVar55 >> 0x17));
                              if (uVar46 == 0xff) {
                                lVar60 = 0;
                                do {
                                  lVar61 = lVar60;
                                  lVar60 = lVar61 + 1;
                                } while ((uint)g->codes[lVar41 * 0x1a4 + lVar61 + 0x611] <=
                                         (uint)sVar55 >> 0x10);
                                sVar15 = g->codes[0xfbd];
                                if (lVar60 == 8) {
                                  g->codes[0xfbd] = (stbi__gif_lzw)((int)sVar15 + -0x10);
                                  uVar58 = 0xffffffff;
                                }
                                else {
                                  uVar58 = 0xffffffff;
                                  if ((int)(lVar61 + 10) <= (int)sVar15) {
                                    lVar59 = (long)(int)(((uint)sVar55 >>
                                                          (0x17U - (char)lVar60 & 0x1f) &
                                                         stbi__bmask[lVar61 + 10]) +
                                                        (int)g->codes[lVar41 * 0x1a4 +
                                                                      lVar61 + 0x623]);
                                    bVar38 = *(byte *)((long)&g->codes[lVar41 * 0x1a4 + 0x5c6].
                                                              prefix + lVar59);
                                    if (((uint)sVar55 >> (-bVar38 & 0x1f) & stbi__bmask[bVar38]) !=
                                        (uint)(ushort)(&g->codes[lVar41 * 0x1a4 + 0x506].prefix)
                                                      [lVar59]) {
LAB_0012ab0d:
                                      __assert_fail(
                                                  "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/stb_image.h"
                                                  ,0x673,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                  );
                                    }
                                    g->codes[0xfbd] =
                                         (stbi__gif_lzw)(((int)sVar15 - (int)lVar60) + -9);
                                    g->codes[0xfbc] =
                                         (stbi__gif_lzw)
                                         ((int)sVar55 << ((byte)(lVar61 + 10) & 0x1f));
                                    uVar58 = (ulong)*(byte *)((long)&g->codes[lVar41 * 0x1a4 + 0x586
                                                                             ].prefix + lVar59);
                                  }
                                }
                              }
                              else {
                                bVar38 = *(byte *)((long)&g->codes[lVar41 * 0x1a4 + 0x5c6].prefix +
                                                  uVar46);
                                uVar58 = 0xffffffff;
                                if ((int)(uint)bVar38 <= (int)g->codes[0xfbd]) {
                                  g->codes[0xfbc] = (stbi__gif_lzw)((int)sVar55 << (bVar38 & 0x1f));
                                  g->codes[0xfbd] =
                                       (stbi__gif_lzw)((int)g->codes[0xfbd] - (uint)bVar38);
                                  uVar58 = (ulong)*(byte *)((long)&g->codes[lVar41 * 0x1a4 + 0x586].
                                                                   prefix + uVar46);
                                }
                              }
                              uVar47 = (uint)uVar58;
                              if ((int)uVar47 < 0) {
                                stbi__g_failure_reason = "bad huffman code";
                                bVar68 = false;
                              }
                              else {
                                uVar46 = uVar58 >> 4;
                                if ((uVar47 & 0xf) == 1) {
                                  if ((int)g->codes[0xfbd] < 1) {
                                    stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                  }
                                  sVar55 = g->codes[0xfbc];
                                  g->codes[0xfbc] = (stbi__gif_lzw)((int)sVar55 * 2);
                                  g->codes[0xfbd] = (stbi__gif_lzw)((int)g->codes[0xfbd] + -1);
                                  sVar64 = (short)(((int)~(uint)sVar55 >> 0x1f | 1U) <<
                                                  (bVar9 & 0x1f));
                                }
                                else {
                                  if ((uVar58 & 0xf) != 0) {
                                    stbi__g_failure_reason = "bad huffman code";
                                    bVar68 = false;
                                    goto LAB_00127605;
                                  }
                                  if (uVar47 < 0xf0) {
                                    g->codes[0xfc5] = (stbi__gif_lzw)~(-1 << ((byte)uVar46 & 0x1f));
                                    uVar58 = 0x40;
                                    if (0xf < uVar47) {
                                      if ((int)g->codes[0xfbd] < (int)uVar46) {
                                        stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                      }
                                      bVar38 = (byte)uVar46 & 0x1f;
                                      uVar18 = (int)g->codes[0xfbc] << bVar38 |
                                               (uint)g->codes[0xfbc] >> 0x20 - bVar38;
                                      uVar47 = stbi__bmask[uVar46];
                                      g->codes[0xfbc] = (stbi__gif_lzw)(~uVar47 & uVar18);
                                      g->codes[0xfbd] =
                                           (stbi__gif_lzw)((int)g->codes[0xfbd] - (int)uVar46);
                                      g->codes[0xfc5] =
                                           (stbi__gif_lzw)((int)g->codes[0xfc5] + (uVar18 & uVar47))
                                      ;
                                    }
                                  }
                                  else {
                                    uVar58 = 0xf;
                                  }
                                  sVar64 = 0;
                                  uVar46 = uVar58;
                                }
                                uVar49 = (ulong)(int)uVar49;
                                do {
                                  if ((long)(int)g->codes[0xfc2] < (long)uVar49) break;
                                  bVar38 = ""[uVar49];
                                  if (psVar56[bVar38] == 0) {
                                    if ((int)uVar46 == 0) {
                                      psVar56[bVar38] = sVar64;
                                      bVar68 = false;
                                      uVar46 = 0;
                                    }
                                    else {
                                      uVar46 = (ulong)((int)uVar46 - 1);
                                      bVar68 = true;
                                    }
                                  }
                                  else {
                                    if ((int)g->codes[0xfbd] < 1) {
                                      stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                    }
                                    sVar55 = g->codes[0xfbc];
                                    g->codes[0xfbc] = (stbi__gif_lzw)((int)sVar55 * 2);
                                    g->codes[0xfbd] = (stbi__gif_lzw)((int)g->codes[0xfbd] + -1);
                                    bVar68 = true;
                                    if (((int)sVar55 < 0) &&
                                       (sVar3 = psVar56[bVar38], (uVar65 & (int)sVar3) == 0)) {
                                      uVar47 = uVar65;
                                      if (sVar3 < 1) {
                                        uVar47 = -uVar65;
                                      }
                                      psVar56[bVar38] = sVar3 + (short)uVar47;
                                    }
                                  }
                                  uVar49 = uVar49 + 1;
                                } while (bVar68);
                                bVar68 = true;
                              }
LAB_00127605:
                              if (!bVar68) {
                                unaff_RBP = (anon_struct_96_18_0d0905d3 *)0x0;
                                goto LAB_0012761e;
                              }
                            } while ((int)uVar49 <= (int)g->codes[0xfc2]);
                          }
                          else {
                            g->codes[0xfc5] = (stbi__gif_lzw)((int)sVar55 + -1);
                            if ((int)g->codes[0xfc1] <= (int)g->codes[0xfc2]) {
                              uVar65 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                              do {
                                bVar9 = ""[uVar49];
                                if (psVar56[bVar9] != 0) {
                                  if ((int)g->codes[0xfbd] < 1) {
                                    stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                  }
                                  sVar55 = g->codes[0xfbc];
                                  g->codes[0xfbc] = (stbi__gif_lzw)((int)sVar55 * 2);
                                  g->codes[0xfbd] = (stbi__gif_lzw)((int)g->codes[0xfbd] + -1);
                                  if (((int)sVar55 < 0) &&
                                     (sVar64 = psVar56[bVar9], (uVar65 & (int)sVar64) == 0)) {
                                    uVar47 = -uVar65;
                                    if (0 < sVar64) {
                                      uVar47 = uVar65;
                                    }
                                    psVar56[bVar9] = (short)uVar47 + sVar64;
                                  }
                                }
                                bVar68 = (long)uVar49 < (long)(int)g->codes[0xfc2];
                                uVar49 = uVar49 + 1;
                              } while (bVar68);
                            }
                          }
LAB_00127619:
                          unaff_RBP = (anon_struct_96_18_0d0905d3 *)0x1;
                        }
LAB_0012761e:
                        paVar54 = (anon_struct_96_18_0d0905d3 *)((ulong)paVar54 & 0xffffffff);
                        if ((int)unaff_RBP == 0) {
                          bVar68 = false;
                        }
                        else {
LAB_0012763a:
                          unaff_RBP = paVar54;
                          sVar55 = g->codes[0xfcd];
                          g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar55 + -1);
                          bVar68 = true;
                          if ((int)sVar55 < 2) {
                            if ((int)g->codes[0xfbd] < 0x18) {
                              stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                            }
                            if ((g->codes[0xfbe].prefix & 0xf8) == 0xd0) {
                              g->codes[0xfbc].prefix = 0;
                              g->codes[0xfbc].first = '\0';
                              g->codes[0xfbc].suffix = '\0';
                              g->codes[0xfbd].prefix = 0;
                              g->codes[0xfbd].first = '\0';
                              g->codes[0xfbd].suffix = '\0';
                              g->codes[0xfbf].prefix = 0;
                              g->codes[0xfbf].first = '\0';
                              g->codes[0xfbf].suffix = '\0';
                              g->codes[0xf92].prefix = 0;
                              g->codes[0xf92].first = '\0';
                              g->codes[0xf92].suffix = '\0';
                              g->codes[0xf7a].prefix = 0;
                              g->codes[0xf7a].first = '\0';
                              g->codes[0xf7a].suffix = '\0';
                              g->codes[0xf62].prefix = 0;
                              g->codes[0xf62].first = '\0';
                              g->codes[0xf62].suffix = '\0';
                              *(uchar *)&g->codes[0xfbe].prefix = 0xff;
                              sVar19 = g->codes[0xfcc];
                              if (sVar19 == (stbi__gif_lzw)0x0) {
                                sVar19.prefix = -1;
                                sVar19.first = 0xff;
                                sVar19.suffix = '\x7f';
                              }
                              g->codes[0xfcd] = sVar19;
                              g->codes[0xfc5].prefix = 0;
                              g->codes[0xfc5].first = '\0';
                              g->codes[0xfc5].suffix = '\0';
                            }
                            else {
                              unaff_RBP = (anon_struct_96_18_0d0905d3 *)0x1;
                              bVar68 = false;
                            }
                          }
                        }
                      }
                      if (!bVar68) {
                        sVar48 = SUB84(unaff_RBP,0);
                        goto LAB_0012800e;
                      }
                      iVar39 = iVar39 + 1;
                      paVar54 = unaff_RBP;
                    } while (iVar39 != iVar24);
                  }
                  iVar62 = iVar62 + 1;
                } while (iVar62 != iVar13);
                sVar48.prefix = 1;
                sVar48.first = '\0';
                sVar48.suffix = '\0';
              }
            }
            else {
              sVar48.prefix = 1;
              sVar48.first = '\0';
              sVar48.suffix = '\0';
              if (0 < (int)g->codes[0xf59]) {
                iVar13 = 0;
                do {
                  if (0 < (int)g->codes[0xf58]) {
                    iVar62 = 0;
                    do {
                      if (0 < (int)g->codes[0xfc7]) {
                        lVar28 = 0;
                        do {
                          sVar14 = g->codes[lVar28 + 0xfc8];
                          lVar41 = (long)(int)sVar14;
                          unaff_RBP = (anon_struct_96_18_0d0905d3 *)(lVar41 * 0x60);
                          if (0 < (int)(g->codes + 0xf5e)[lVar41 * 0x18]) {
                            unaff_RBP = paVar1 + lVar41;
                            iVar24 = 0;
                            bVar68 = true;
LAB_00127c8c:
                            iVar39 = unaff_RBP->h;
                            if (iVar39 < 1) goto LAB_00127ce9;
                            iVar25 = 0;
                            while (iVar39 = stbi__jpeg_decode_block_prog_dc
                                                      ((stbi__jpeg *)g,
                                                       unaff_RBP->coeff +
                                                       (iVar39 * iVar62 + iVar25 +
                                                       (unaff_RBP->v * iVar13 + iVar24) *
                                                       unaff_RBP->coeff_w) * 0x40,
                                                       (stbi__huffman *)
                                                       (g->pal + (long)unaff_RBP->hd * 0x1a4 + -10),
                                                       (int)sVar14), iVar39 != 0) {
                              iVar25 = iVar25 + 1;
                              iVar39 = unaff_RBP->h;
                              if (iVar39 <= iVar25) goto LAB_00127ce9;
                            }
                            if (!bVar68) goto LAB_00127d07;
LAB_00127ffd:
                            sVar48.prefix = 0;
                            sVar48.first = '\0';
                            sVar48.suffix = '\0';
                            goto LAB_0012800e;
                          }
LAB_00127d07:
                          lVar28 = lVar28 + 1;
                        } while (lVar28 < (int)g->codes[0xfc7]);
                      }
                      sVar14 = g->codes[0xfcd];
                      g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar14 + -1);
                      sVar48.prefix = 1;
                      sVar48.first = '\0';
                      sVar48.suffix = '\0';
                      if ((int)sVar14 < 2) {
                        if ((int)g->codes[0xfbd] < 0x18) {
                          stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                        }
                        if ((g->codes[0xfbe].prefix & 0xf8) != 0xd0) goto LAB_0012800e;
                        g->codes[0xfbc].prefix = 0;
                        g->codes[0xfbc].first = '\0';
                        g->codes[0xfbc].suffix = '\0';
                        g->codes[0xfbd].prefix = 0;
                        g->codes[0xfbd].first = '\0';
                        g->codes[0xfbd].suffix = '\0';
                        g->codes[0xfbf].prefix = 0;
                        g->codes[0xfbf].first = '\0';
                        g->codes[0xfbf].suffix = '\0';
                        g->codes[0xf92].prefix = 0;
                        g->codes[0xf92].first = '\0';
                        g->codes[0xf92].suffix = '\0';
                        g->codes[0xf7a].prefix = 0;
                        g->codes[0xf7a].first = '\0';
                        g->codes[0xf7a].suffix = '\0';
                        g->codes[0xf62].prefix = 0;
                        g->codes[0xf62].first = '\0';
                        g->codes[0xf62].suffix = '\0';
                        *(uchar *)&g->codes[0xfbe].prefix = 0xff;
                        sVar22 = g->codes[0xfcc];
                        if (sVar22 == (stbi__gif_lzw)0x0) {
                          sVar22.prefix = -1;
                          sVar22.first = 0xff;
                          sVar22.suffix = '\x7f';
                        }
                        g->codes[0xfcd] = sVar22;
                        g->codes[0xfc5].prefix = 0;
                        g->codes[0xfc5].first = '\0';
                        g->codes[0xfc5].suffix = '\0';
                      }
                      iVar62 = iVar62 + 1;
                    } while (iVar62 < (int)g->codes[0xf58]);
                  }
                  sVar48.prefix = 1;
                  sVar48.first = '\0';
                  sVar48.suffix = '\0';
                  iVar13 = iVar13 + 1;
                } while (iVar13 < (int)g->codes[0xf59]);
              }
            }
LAB_0012800e:
            if (sVar48 == (stbi__gif_lzw)0x0) break;
            if ((uchar)g->codes[0xfbe].prefix == 0xff) {
              do {
                lVar28 = *(long *)g;
                if (*(long *)(lVar28 + 0x10) == 0) {
LAB_00128049:
                  if (*(ulong *)(lVar28 + 0xc0) <= *(ulong *)(lVar28 + 0xb8)) goto LAB_0012801f;
                }
                else {
                  iVar13 = (**(code **)(lVar28 + 0x20))(*(undefined8 *)(lVar28 + 0x28));
                  if (iVar13 != 0) {
                    if (*(int *)(lVar28 + 0x30) != 0) goto LAB_00128049;
                    goto LAB_0012801f;
                  }
                }
                lVar28 = *(long *)g;
                pcVar29 = *(char **)(lVar28 + 0xb8);
                if (pcVar29 < *(char **)(lVar28 + 0xc0)) {
LAB_001280ce:
                  *(char **)(lVar28 + 0xb8) = pcVar29 + 1;
                  cVar10 = *pcVar29;
                }
                else {
                  if (*(int *)(lVar28 + 0x30) != 0) {
                    lVar41 = lVar28 + 0x38;
                    iVar13 = (**(code **)(lVar28 + 0x10))
                                       (*(undefined8 *)(lVar28 + 0x28),lVar41,
                                        *(undefined4 *)(lVar28 + 0x34));
                    if (iVar13 == 0) {
                      *(undefined4 *)(lVar28 + 0x30) = 0;
                      *(long *)(lVar28 + 0xb8) = lVar41;
                      *(long *)(lVar28 + 0xc0) = lVar28 + 0x39;
                      *(undefined1 *)(lVar28 + 0x38) = 0;
                    }
                    else {
                      *(long *)(lVar28 + 0xb8) = lVar41;
                      *(long *)(lVar28 + 0xc0) = iVar13 + lVar41;
                    }
                    pcVar29 = *(char **)(lVar28 + 0xb8);
                    goto LAB_001280ce;
                  }
                  cVar10 = '\0';
                }
                if (cVar10 != '\0') {
                  if (cVar10 == -1) {
                    lVar28 = *(long *)g;
                    puVar31 = *(uchar **)(lVar28 + 0xb8);
                    if (puVar31 < *(uchar **)(lVar28 + 0xc0)) {
LAB_00128177:
                      *(uchar **)(lVar28 + 0xb8) = puVar31 + 1;
                      uVar11 = *puVar31;
                    }
                    else {
                      if (*(int *)(lVar28 + 0x30) != 0) {
                        lVar41 = lVar28 + 0x38;
                        iVar13 = (**(code **)(lVar28 + 0x10))
                                           (*(undefined8 *)(lVar28 + 0x28),lVar41,
                                            *(undefined4 *)(lVar28 + 0x34));
                        if (iVar13 == 0) {
                          *(undefined4 *)(lVar28 + 0x30) = 0;
                          *(long *)(lVar28 + 0xb8) = lVar41;
                          *(long *)(lVar28 + 0xc0) = lVar28 + 0x39;
                          *(undefined1 *)(lVar28 + 0x38) = 0;
                        }
                        else {
                          *(long *)(lVar28 + 0xb8) = lVar41;
                          *(long *)(lVar28 + 0xc0) = iVar13 + lVar41;
                        }
                        puVar31 = *(uchar **)(lVar28 + 0xb8);
                        goto LAB_00128177;
                      }
                      uVar11 = '\0';
                    }
                    *(uchar *)&g->codes[0xfbe].prefix = uVar11;
                    cVar10 = '\b';
                  }
                  else {
                    stbi__g_failure_reason = "junk before marker";
                    cVar10 = '\x01';
                  }
                }
              } while (cVar10 == '\0');
              if (cVar10 != '\b') break;
            }
          }
          else {
            if (bVar9 == 0xd9) {
              if ((g->codes[0xfc0] != (stbi__gif_lzw)0x0) && (0 < *(int *)(*(long *)g + 8))) {
                lVar28 = 0;
                do {
                  iVar13 = (int)g->codes[lVar28 * 0x18 + 0xf64] + 7 >> 3;
                  if (0 < iVar13) {
                    uVar65 = paVar1[lVar28].x + 7 >> 3;
                    iVar62 = 0;
                    do {
                      if (0 < (int)uVar65) {
                        uVar49 = 0;
                        do {
                          psVar56 = paVar1[lVar28].coeff +
                                    (paVar1[lVar28].coeff_w * iVar62 + (int)uVar49) * 0x40;
                          iVar24 = paVar1[lVar28].tq;
                          lVar41 = 0;
                          do {
                            psVar56[lVar41] =
                                 (ushort)*(byte *)((long)&g->codes[(long)iVar24 * 0x10 + 0xb16].
                                                          prefix + lVar41) * psVar56[lVar41];
                            lVar41 = lVar41 + 1;
                          } while (lVar41 != 0x40);
                          (**(_func_void_stbi_uc_ptr_int_short_ptr **)(g->codes + 0xfce))
                                    (paVar1[lVar28].data +
                                     uVar49 * 8 + (long)(iVar62 * 8 * paVar1[lVar28].w2),
                                     paVar1[lVar28].w2,psVar56);
                          uVar49 = uVar49 + 1;
                        } while (uVar49 != uVar65);
                      }
                      iVar62 = iVar62 + 1;
                    } while (iVar62 != iVar13);
                  }
                  lVar28 = lVar28 + 1;
                } while (lVar28 < *(int *)(*(long *)g + 8));
              }
              if (req_comp == 0) {
                req_comp = *(uint *)(*(long *)g + 8);
              }
              uVar65 = *(uint *)(*(long *)g + 8);
              uVar47 = 1;
              if (2 < req_comp) {
                uVar47 = uVar65;
              }
              if (uVar65 != 3) {
                uVar47 = uVar65;
              }
              if (0 < (int)uVar47) {
                lVar28 = 0;
                do {
                  iVar13 = **(int **)g;
                  pvVar32 = malloc((ulong)(iVar13 + 3));
                  *(void **)((long)&g->codes[0xf6e].prefix + lVar28 * 2) = pvVar32;
                  if (pvVar32 == (void *)0x0) {
                    stbi__cleanup_jpeg((stbi__jpeg *)g);
                    stbi__g_failure_reason = "outofmem";
                  }
                  else {
                    uVar49 = (long)(int)g->codes[0xf56] /
                             (long)*(int *)((long)&g->codes[0xf5d].prefix + lVar28 * 2);
                    iVar62 = (int)uVar49;
                    *(int *)((long)&local_47a0 + lVar28) = iVar62;
                    iVar24 = (int)g->codes[0xf57] /
                             *(int *)((long)&g->codes[0xf5e].prefix + lVar28 * 2);
                    *(int *)((long)&local_47a0 + lVar28 + 4) = iVar24;
                    *(int *)((long)local_4798 + lVar28 + 4) = iVar24 >> 1;
                    *(int *)((long)local_4798 + lVar28) =
                         (int)((ulong)((iVar62 + iVar13) - 1) / (uVar49 & 0xffffffff));
                    *(undefined4 *)((long)local_4798 + lVar28 + 8) = 0;
                    uVar34 = *(undefined8 *)((long)&g->codes[0xf68].prefix + lVar28 * 2);
                    *(undefined8 *)((long)local_47b0 + lVar28 + 8) = uVar34;
                    *(undefined8 *)((long)local_47b0 + lVar28) = uVar34;
                    if ((iVar62 == 1) && (iVar24 == 1)) {
                      *(code **)(local_47b8 + lVar28) = resample_row_1;
                    }
                    else {
                      if ((iVar62 == 1) && (iVar24 == 2)) {
                        pcVar33 = stbi__resample_row_v_2;
                      }
                      else if ((iVar62 == 2) && (iVar24 == 1)) {
                        pcVar33 = stbi__resample_row_h_2;
                      }
                      else if ((iVar62 == 2) && (iVar24 == 2)) {
                        pcVar33 = *(code **)(g->codes + 0xfd2);
                      }
                      else {
                        pcVar33 = stbi__resample_row_generic;
                      }
                      *(code **)(local_47b8 + lVar28) = pcVar33;
                    }
                  }
                  data = (stbi__context *)0x0;
                  if (pvVar32 == (void *)0x0) goto LAB_00128f02;
                  lVar28 = lVar28 + 0x30;
                } while ((ulong)uVar47 * 0x30 != lVar28);
              }
              piVar50 = *(int **)g;
              iVar13 = piVar50[1];
              data = (stbi__context *)malloc((ulong)(*piVar50 * req_comp * iVar13 + 1));
              if (data == (stbi__context *)0x0) {
                stbi__cleanup_jpeg((stbi__jpeg *)g);
                stbi__g_failure_reason = "outofmem";
                data = (stbi__context *)0x0;
              }
              else {
                if (iVar13 != 0) {
                  iVar13 = 0;
                  uVar65 = 0;
                  do {
                    iVar62 = *piVar50;
                    if (0 < (int)uVar47) {
                      piVar50 = local_4798 + 2;
                      uVar49 = 0;
                      psVar63 = g->codes + 0xf64;
                      do {
                        iVar24 = piVar50[-1];
                        iVar39 = piVar50[-3];
                        iVar25 = iVar39 >> 1;
                        uVar34 = (**(code **)(piVar50 + -10))
                                           (*(stbi_uc **)(psVar63 + 10),
                                            *(undefined8 *)
                                             ((long)piVar50 +
                                             ((ulong)(iVar25 <= iVar24) << 3 | 0xffffffffffffffe0)),
                                            *(undefined8 *)
                                             ((long)piVar50 +
                                             ((ulong)(iVar24 < iVar25) << 3 | 0xffffffffffffffe0)),
                                            piVar50[-2],piVar50[-4]);
                        *(undefined8 *)(&local_47e8.bpp + uVar49 * 2) = uVar34;
                        piVar50[-1] = iVar24 + 1;
                        if (iVar39 <= iVar24 + 1) {
                          piVar50[-1] = 0;
                          *(long *)(piVar50 + -8) = *(long *)(piVar50 + -6);
                          iVar24 = *piVar50;
                          *piVar50 = iVar24 + 1;
                          if (iVar24 + 1 < (int)*psVar63) {
                            *(long *)(piVar50 + -6) =
                                 *(long *)(piVar50 + -6) + (long)(int)psVar63[1];
                          }
                        }
                        uVar49 = uVar49 + 1;
                        psVar63 = psVar63 + 0x18;
                        piVar50 = piVar50 + 0xc;
                      } while (uVar47 != uVar49);
                    }
                    psVar35 = (stbi_uc *)CONCAT44(local_47e8.offset,local_47e8.bpp);
                    puVar5 = *(uint **)g;
                    if (req_comp < 3) {
                      if (req_comp == 1) {
                        if (*puVar5 != 0) {
                          uVar49 = 0;
                          do {
                            data->buffer_start[uVar49 + (uint)(iVar62 * iVar13) + -0x38] =
                                 psVar35[uVar49];
                            uVar49 = uVar49 + 1;
                          } while (uVar49 < *puVar5);
                        }
                      }
                      else if (*puVar5 != 0) {
                        uVar49 = 0;
                        do {
                          data->buffer_start[uVar49 * 2 + (ulong)(uint)(iVar62 * iVar13) + -0x38] =
                               psVar35[uVar49];
                          data->buffer_start[uVar49 * 2 + (ulong)(uint)(iVar62 * iVar13) + -0x37] =
                               0xff;
                          uVar49 = uVar49 + 1;
                        } while (uVar49 < *puVar5);
                      }
                    }
                    else if (puVar5[2] == 3) {
                      if (g->codes[0xfc6] == (stbi__gif_lzw)0x3) {
                        if (*puVar5 != 0) {
                          psVar51 = data->buffer_start + ((ulong)(uint)(iVar62 * iVar13) - 0x35);
                          uVar49 = 0;
                          do {
                            psVar51[-3] = psVar35[uVar49];
                            psVar51[-2] = *(undefined1 *)
                                           (CONCAT44(local_47e8.mr,local_47e8.hsz) + uVar49);
                            psVar51[-1] = *(undefined1 *)
                                           (CONCAT44(local_47e8.mb,local_47e8.mg) + uVar49);
                            *psVar51 = 0xff;
                            uVar49 = uVar49 + 1;
                            psVar51 = psVar51 + (uint)req_comp;
                          } while (uVar49 < *puVar5);
                        }
                      }
                      else {
                        (**(_func_void_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int **)
                           (g->codes + 0xfd0))
                                  (data->buffer_start + ((ulong)(uVar65 * req_comp * iVar62) - 0x38)
                                   ,psVar35,(stbi_uc *)CONCAT44(local_47e8.mr,local_47e8.hsz),
                                   (stbi_uc *)CONCAT44(local_47e8.mb,local_47e8.mg),*puVar5,req_comp
                                  );
                      }
                    }
                    else if (*puVar5 != 0) {
                      psVar51 = data->buffer_start + ((ulong)(uint)(iVar62 * iVar13) - 0x35);
                      uVar49 = 0;
                      do {
                        sVar8 = psVar35[uVar49];
                        psVar51[-1] = sVar8;
                        psVar51[-2] = sVar8;
                        psVar51[-3] = sVar8;
                        *psVar51 = 0xff;
                        uVar49 = uVar49 + 1;
                        psVar51 = psVar51 + (uint)req_comp;
                      } while (uVar49 < *puVar5);
                    }
                    uVar65 = uVar65 + 1;
                    piVar50 = *(int **)g;
                    iVar13 = iVar13 + req_comp;
                  } while (uVar65 < (uint)piVar50[1]);
                }
                stbi__cleanup_jpeg((stbi__jpeg *)g);
                piVar50 = *(int **)g;
                *x = *piVar50;
                *y = piVar50[1];
                if (comp != (int *)0x0) {
                  *comp = piVar50[2];
                }
              }
              goto LAB_00128f02;
            }
            iVar13 = stbi__process_marker((stbi__jpeg *)g,(uint)bVar9);
            if (iVar13 == 0) break;
          }
LAB_0012801f:
          bVar9 = stbi__get_marker((stbi__jpeg *)g);
        } while( true );
      }
LAB_00128ef3:
      stbi__cleanup_jpeg((stbi__jpeg *)g);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
    data = (stbi__context *)0x0;
    goto LAB_00128f02;
  }
  iVar13 = stbi__check_png_header(s);
  psVar35 = s->img_buffer_original;
  s->img_buffer = psVar35;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar13 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (uchar *)0x0;
    }
    local_47b8 = (undefined1  [8])s;
    iVar13 = stbi__parse_png_file((stbi__png *)local_47b8,0,req_comp);
    puVar31 = local_47a0;
    if (iVar13 == 0) {
      puVar31 = (uchar *)0x0;
    }
    else {
      if (local_4798[0] == 0x10) {
        uVar65 = *(stbi__uint32 *)((long)local_47b8 + 4) * *(stbi__uint32 *)local_47b8 *
                 *(int *)((long)local_47b8 + 0xc);
        puVar30 = (uchar *)malloc((long)(int)uVar65);
        if (0 < (int)uVar65) {
          uVar49 = 0;
          do {
            puVar30[uVar49] = local_47a0[uVar49 * 2 + 1];
            uVar49 = uVar49 + 1;
          } while (uVar65 != uVar49);
        }
        local_47a0 = puVar30;
        free(puVar31);
      }
      puVar31 = local_47a0;
      auVar7 = local_47b8;
      local_47a0 = (uchar *)0x0;
      if ((req_comp != 0) && (*(int *)((long)local_47b8 + 0xc) != req_comp)) {
        puVar31 = stbi__convert_format
                            (puVar31,*(int *)((long)local_47b8 + 0xc),req_comp,
                             *(stbi__uint32 *)local_47b8,*(stbi__uint32 *)((long)local_47b8 + 4));
        *(int *)((long)auVar7 + 0xc) = req_comp;
        if (puVar31 == (uchar *)0x0) {
          return (uchar *)0x0;
        }
      }
      *x = *(stbi__uint32 *)local_47b8;
      *y = *(stbi__uint32 *)((long)local_47b8 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)((long)local_47b8 + 8);
      }
    }
    free(local_47a0);
    local_47a0 = (stbi_uc *)0x0;
    free(local_47b0[1]);
    local_47b0[1] = (stbi_uc *)0x0;
    free(local_47b0[0]);
    return puVar31;
  }
  if (psVar35 < s->img_buffer_original_end) {
LAB_00128365:
    s->img_buffer = psVar35 + 1;
    bVar68 = true;
    if (*psVar35 == 'B') {
      psVar35 = s->img_buffer;
      if (s->img_buffer_end <= psVar35) {
        if (s->read_from_callbacks == 0) goto LAB_0012847c;
        psVar35 = s->buffer_start;
        iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
        if (iVar13 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar35;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar35;
          s->img_buffer_end = psVar35 + iVar13;
        }
        psVar35 = s->img_buffer;
      }
      s->img_buffer = psVar35 + 1;
      if (*psVar35 == 'M') {
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar65 = stbi__get16le(s);
        iVar13 = stbi__get16le(s);
        uVar65 = iVar13 << 0x10 | uVar65;
        bVar68 = false;
        if ((((0x38 < uVar65) || ((0x100010000001000U >> ((ulong)uVar65 & 0x3f) & 1) == 0)) &&
            (uVar65 != 0x6c)) && (bVar68 = false, uVar65 != 0x7c)) goto LAB_00128472;
      }
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar35 = s->buffer_start;
      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
      if (iVar13 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar35;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar35 + iVar13;
      }
      psVar35 = s->img_buffer;
      goto LAB_00128365;
    }
LAB_00128472:
    bVar68 = true;
  }
LAB_0012847c:
  psVar35 = s->img_buffer_original;
  s->img_buffer = psVar35;
  s->img_buffer_end = s->img_buffer_original_end;
  if (!bVar68) {
    local_47e8.all_a = 0xff;
    pvVar32 = stbi__bmp_parse_header(s,&local_47e8);
    local_4868 = local_47e8.all_a;
    if (pvVar32 == (void *)0x0) {
      return (uchar *)0x0;
    }
    sVar4 = s->img_y;
    sVar57 = -sVar4;
    if (0 < (int)sVar4) {
      sVar57 = sVar4;
    }
    s->img_y = sVar57;
    if (local_47e8.hsz == 0xc) {
      if (local_47e8.bpp < 0x18) {
        uVar65 = (local_47e8.offset + -0x26) / 3;
      }
      else {
LAB_00128576:
        uVar65 = 0;
      }
    }
    else {
      if (0xf < local_47e8.bpp) goto LAB_00128576;
      uVar65 = (local_47e8.offset - local_47e8.hsz) + -0xe >> 2;
    }
    iVar13 = 4 - (uint)(local_47e8.ma == 0);
    s->img_n = iVar13;
    if (2 < req_comp) {
      iVar13 = req_comp;
    }
    puVar31 = (uchar *)malloc((ulong)(sVar57 * iVar13 * s->img_x));
    if (puVar31 == (uchar *)0x0) {
      stbi__g_failure_reason = "outofmem";
      return (uchar *)0x0;
    }
    if (local_47e8.bpp < 0x10) {
      if (0x100 < (int)uVar65 || uVar65 == 0) {
        free(puVar31);
        stbi__g_failure_reason = "invalid";
        return (uchar *)0x0;
      }
      if (0 < (int)uVar65) {
        psVar35 = s->buffer_start;
        psVar51 = s->buffer_start + 1;
        uVar49 = 0;
        do {
          psVar36 = s->img_buffer;
          if (psVar36 < s->img_buffer_end) {
LAB_00128789:
            s->img_buffer = psVar36 + 1;
            sVar8 = *psVar36;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
              if (iVar62 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar51;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar35 + iVar62;
              }
              psVar36 = s->img_buffer;
              goto LAB_00128789;
            }
            sVar8 = '\0';
          }
          local_47b8[uVar49 * 4 + 2] = sVar8;
          psVar36 = s->img_buffer;
          if (psVar36 < s->img_buffer_end) {
LAB_00128814:
            s->img_buffer = psVar36 + 1;
            sVar8 = *psVar36;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
              if (iVar62 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar51;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar35 + iVar62;
              }
              psVar36 = s->img_buffer;
              goto LAB_00128814;
            }
            sVar8 = '\0';
          }
          local_47b8[uVar49 * 4 + 1] = sVar8;
          psVar36 = s->img_buffer;
          if (psVar36 < s->img_buffer_end) {
LAB_0012889f:
            s->img_buffer = psVar36 + 1;
            sVar8 = *psVar36;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
              if (iVar62 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar51;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar35 + iVar62;
              }
              psVar36 = s->img_buffer;
              goto LAB_0012889f;
            }
            sVar8 = '\0';
          }
          local_47b8[uVar49 * 4] = sVar8;
          if (local_47e8.hsz != 0xc) {
            psVar36 = s->img_buffer;
            if (s->img_buffer_end <= psVar36) {
              if (s->read_from_callbacks == 0) goto LAB_00128935;
              iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
              if (iVar62 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar51;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar35;
                s->img_buffer_end = psVar35 + iVar62;
              }
              psVar36 = s->img_buffer;
            }
            s->img_buffer = psVar36 + 1;
          }
LAB_00128935:
          local_47b8[uVar49 * 4 + 3] = 0xff;
          uVar49 = uVar49 + 1;
        } while (uVar65 != uVar49);
      }
      stbi__skip(s,(uVar65 * (local_47e8.hsz == 0xc | 0xfffffffc) - local_47e8.hsz) +
                   local_47e8.offset + -0xe);
      if (local_47e8.bpp == 8) {
        uVar65 = s->img_x;
      }
      else {
        if (local_47e8.bpp != 4) {
          free(puVar31);
          stbi__g_failure_reason = "bad bpp";
          return (uchar *)0x0;
        }
        uVar65 = s->img_x + 1 >> 1;
      }
      if (0 < (int)s->img_y) {
        local_4880 = (stbi__gif_lzw)(-uVar65 & 3);
        psVar35 = s->buffer_start;
        uVar49 = 0;
        iVar62 = 0;
        do {
          if (0 < (int)s->img_x) {
            iVar24 = 0;
            do {
              pbVar37 = s->img_buffer;
              if (pbVar37 < s->img_buffer_end) {
LAB_0012985f:
                s->img_buffer = pbVar37 + 1;
                uVar65 = (uint)*pbVar37;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                  if (iVar39 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar35;
                    s->img_buffer_end = s->buffer_start + 1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar35;
                    s->img_buffer_end = psVar35 + iVar39;
                  }
                  pbVar37 = s->img_buffer;
                  goto LAB_0012985f;
                }
                uVar65 = 0;
              }
              uVar47 = uVar65 >> 4;
              if (local_47e8.bpp != 4) {
                uVar47 = uVar65;
              }
              uVar46 = (ulong)uVar47;
              uVar65 = uVar65 & 0xf;
              if (local_47e8.bpp != 4) {
                uVar65 = 0;
              }
              lVar28 = (long)(int)uVar49;
              uVar58 = lVar28 + 3;
              puVar31[lVar28] = local_47b8[uVar46 * 4];
              puVar31[lVar28 + 1] = local_47b8[uVar46 * 4 + 1];
              puVar31[lVar28 + 2] = local_47b8[uVar46 * 4 + 2];
              if (iVar13 == 4) {
                puVar31[lVar28 + 3] = 0xff;
                uVar58 = (ulong)((int)uVar49 + 4);
              }
              sVar57 = s->img_x;
              if (iVar24 + 1U == sVar57) {
LAB_00129997:
                uVar49 = uVar58 & 0xffffffff;
              }
              else {
                if (local_47e8.bpp == 8) {
                  pbVar37 = s->img_buffer;
                  if (s->img_buffer_end <= pbVar37) {
                    if (s->read_from_callbacks == 0) {
                      uVar65 = 0;
                      goto LAB_00129961;
                    }
                    iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                    if (iVar39 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar35;
                      s->img_buffer_end = s->buffer_start + 1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar35;
                      s->img_buffer_end = psVar35 + iVar39;
                    }
                    pbVar37 = s->img_buffer;
                  }
                  s->img_buffer = pbVar37 + 1;
                  uVar65 = (uint)*pbVar37;
                }
LAB_00129961:
                lVar28 = (long)(int)uVar58;
                uVar49 = lVar28 + 3;
                uVar46 = (ulong)uVar65;
                puVar31[lVar28] = local_47b8[uVar46 * 4];
                puVar31[lVar28 + 1] = local_47b8[uVar46 * 4 + 1];
                puVar31[lVar28 + 2] = local_47b8[uVar46 * 4 + 2];
                if (iVar13 == 4) {
                  uVar58 = (ulong)((int)uVar58 + 4);
                  puVar31[lVar28 + 3] = 0xff;
                  goto LAB_00129997;
                }
              }
            } while ((iVar24 + 1U != sVar57) && (iVar24 = iVar24 + 2, iVar24 < (int)s->img_x));
          }
          stbi__skip(s,(int)local_4880);
          iVar62 = iVar62 + 1;
        } while (iVar62 < (int)s->img_y);
      }
      goto LAB_001299de;
    }
    stbi__skip(s,(local_47e8.offset - local_47e8.hsz) + -0xe);
    if (local_47e8.bpp == 0x18) {
      iVar62 = -3;
LAB_00128f2b:
      uVar65 = iVar62 * s->img_x & 3;
    }
    else {
      uVar65 = 0;
      if (local_47e8.bpp == 0x10) {
        iVar62 = -2;
        goto LAB_00128f2b;
      }
    }
    iVar62 = 0;
    if (local_47e8.bpp == 0x18) {
      bVar68 = false;
LAB_00128f9c:
      bVar67 = false;
    }
    else {
      if (local_47e8.bpp != 0x20) {
        bVar68 = true;
        goto LAB_00128f9c;
      }
      bVar67 = local_47e8.ma == 0xff000000 &&
               (local_47e8.mr == 0xff0000 && (local_47e8.mg == 0xff00 && local_47e8.mb == 0xff));
      bVar68 = local_47e8.ma != 0xff000000 ||
               (local_47e8.mr != 0xff0000 || (local_47e8.mg != 0xff00 || local_47e8.mb != 0xff));
    }
    iVar24 = 0;
    iVar39 = 0;
    local_4814 = 0;
    uVar44 = 0;
    uVar47 = 0;
    uVar18 = 0;
    local_47f4 = 0;
    if (bVar68) {
      if ((local_47e8.mg != 0 && local_47e8.mr != 0) && local_47e8.mb != 0) {
        iVar62 = stbi__high_bit(local_47e8.mr);
        iVar62 = iVar62 + -7;
        uVar47 = (local_47e8.mr >> 1 & 0x55555555) + (local_47e8.mr & 0x55555555);
        uVar47 = (uVar47 >> 2 & 0x33333333) + (uVar47 & 0x33333333);
        uVar47 = (uVar47 >> 4) + uVar47 & 0xf0f0f0f;
        uVar47 = (uVar47 >> 8) + uVar47;
        uVar44 = (uVar47 >> 0x10) + uVar47 & 0xff;
        iVar24 = stbi__high_bit(local_47e8.mg);
        iVar24 = iVar24 + -7;
        uVar47 = (local_47e8.mg >> 1 & 0x55555555) + (local_47e8.mg & 0x55555555);
        uVar47 = (uVar47 >> 2 & 0x33333333) + (uVar47 & 0x33333333);
        uVar47 = (uVar47 >> 4) + uVar47 & 0xf0f0f0f;
        uVar47 = (uVar47 >> 8) + uVar47;
        uVar47 = (uVar47 >> 0x10) + uVar47 & 0xff;
        iVar39 = stbi__high_bit(local_47e8.mb);
        iVar39 = iVar39 + -7;
        uVar18 = (local_47e8.mb >> 1 & 0x55555555) + (local_47e8.mb & 0x55555555);
        uVar18 = (uVar18 >> 2 & 0x33333333) + (uVar18 & 0x33333333);
        uVar18 = (uVar18 >> 4) + uVar18 & 0xf0f0f0f;
        uVar18 = (uVar18 >> 8) + uVar18;
        uVar18 = (uVar18 >> 0x10) + uVar18 & 0xff;
        local_4814 = stbi__high_bit(local_47e8.ma);
        local_4814 = local_4814 + -7;
        uVar27 = (local_47e8.ma >> 1 & 0x55555555) + (local_47e8.ma & 0x55555555);
        uVar27 = (uVar27 >> 2 & 0x33333333) + (uVar27 & 0x33333333);
        uVar27 = (uVar27 >> 4) + uVar27 & 0xf0f0f0f;
        uVar27 = (uVar27 >> 8) + uVar27;
        local_47f4 = (uVar27 >> 0x10) + uVar27 & 0xff;
        goto LAB_00129196;
      }
      free(puVar31);
      stbi__g_failure_reason = "bad masks";
      bVar68 = false;
    }
    else {
LAB_00129196:
      if (0 < (int)s->img_y) {
        local_47c0 = s->buffer_start;
        psVar35 = s->buffer_start + 1;
        local_47c4 = -local_4814;
        iVar20 = 0;
        iVar25 = 0;
        do {
          psVar51 = local_47c0;
          local_47c8 = iVar25;
          if (bVar68) {
            if (0 < (int)s->img_x) {
              iVar25 = 0;
              do {
                uVar27 = stbi__get16le(s);
                if (local_47e8.bpp != 0x10) {
                  iVar26 = stbi__get16le(s);
                  uVar27 = uVar27 | iVar26 << 0x10;
                }
                iVar26 = (int)(uVar27 & local_47e8.mr) >> ((byte)iVar62 & 0x1f);
                if (iVar62 < 0) {
                  iVar26 = (uVar27 & local_47e8.mr) << (-(byte)iVar62 & 0x1f);
                }
                uVar53 = uVar44;
                iVar45 = iVar26;
                if (uVar44 < 8) {
                  do {
                    iVar45 = iVar45 + (iVar26 >> ((byte)uVar53 & 0x1f));
                    uVar42 = (undefined1)iVar45;
                    uVar53 = uVar53 + uVar44;
                  } while (uVar53 < 8);
                }
                else {
                  uVar42 = (undefined1)iVar26;
                }
                iVar26 = (int)(uVar27 & local_47e8.mg) >> ((byte)iVar24 & 0x1f);
                if (iVar24 < 0) {
                  iVar26 = (uVar27 & local_47e8.mg) << (-(byte)iVar24 & 0x1f);
                }
                puVar31[iVar20] = uVar42;
                uVar53 = uVar47;
                iVar45 = iVar26;
                if (uVar47 < 8) {
                  do {
                    iVar45 = iVar45 + (iVar26 >> ((byte)uVar53 & 0x1f));
                    uVar42 = (undefined1)iVar45;
                    uVar53 = uVar53 + uVar47;
                  } while (uVar53 < 8);
                }
                else {
                  uVar42 = (undefined1)iVar26;
                }
                iVar26 = (int)(uVar27 & local_47e8.mb) >> ((byte)iVar39 & 0x1f);
                if (iVar39 < 0) {
                  iVar26 = (uVar27 & local_47e8.mb) << (-(byte)iVar39 & 0x1f);
                }
                puVar31[(long)iVar20 + 1] = uVar42;
                uVar53 = uVar18;
                iVar45 = iVar26;
                if (uVar18 < 8) {
                  do {
                    iVar45 = iVar45 + (iVar26 >> ((byte)uVar53 & 0x1f));
                    uVar42 = (undefined1)iVar45;
                    uVar53 = uVar53 + uVar18;
                  } while (uVar53 < 8);
                }
                else {
                  uVar42 = (undefined1)iVar26;
                }
                puVar31[(long)iVar20 + 2] = uVar42;
                if (local_47e8.ma == 0) {
                  uVar27 = 0xff;
                }
                else {
                  uVar40 = (uVar27 & local_47e8.ma) << ((byte)local_47c4 & 0x1f);
                  uVar27 = (int)(uVar27 & local_47e8.ma) >> ((byte)local_4814 & 0x1f);
                  uVar53 = local_47f4;
                  uVar66 = uVar27;
                  if (local_4814 < 0) {
                    uVar27 = uVar40;
                    uVar66 = uVar40;
                  }
                  for (; uVar53 < 8; uVar53 = uVar53 + local_47f4) {
                    uVar27 = uVar27 + ((int)uVar66 >> ((byte)uVar53 & 0x1f));
                  }
                }
                iVar26 = iVar20 + 3;
                if (iVar13 == 4) {
                  puVar31[(long)iVar20 + 3] = (char)uVar27;
                  iVar26 = iVar20 + 4;
                }
                iVar20 = iVar26;
                local_4868 = local_4868 | uVar27;
                iVar25 = iVar25 + 1;
              } while (iVar25 < (int)s->img_x);
            }
          }
          else if (0 < (int)s->img_x) {
            iVar25 = 0;
            do {
              psVar36 = s->img_buffer;
              if (psVar36 < s->img_buffer_end) {
LAB_00129431:
                s->img_buffer = psVar36 + 1;
                sVar8 = *psVar36;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar26 = (*(s->io).read)(s->io_user_data,(char *)psVar51,s->buflen);
                  if (iVar26 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar51;
                    s->img_buffer_end = psVar35;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar51;
                    s->img_buffer_end = psVar51 + iVar26;
                  }
                  psVar36 = s->img_buffer;
                  goto LAB_00129431;
                }
                sVar8 = '\0';
              }
              puVar31[(long)iVar20 + 2] = sVar8;
              psVar36 = s->img_buffer;
              if (psVar36 < s->img_buffer_end) {
LAB_001294dd:
                s->img_buffer = psVar36 + 1;
                sVar8 = *psVar36;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar26 = (*(s->io).read)(s->io_user_data,(char *)psVar51,s->buflen);
                  if (iVar26 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar51;
                    s->img_buffer_end = psVar35;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar51;
                    s->img_buffer_end = psVar51 + iVar26;
                  }
                  psVar36 = s->img_buffer;
                  goto LAB_001294dd;
                }
                sVar8 = '\0';
              }
              puVar31[(long)iVar20 + 1] = sVar8;
              psVar36 = s->img_buffer;
              if (psVar36 < s->img_buffer_end) {
LAB_00129586:
                s->img_buffer = psVar36 + 1;
                sVar8 = *psVar36;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar26 = (*(s->io).read)(s->io_user_data,(char *)psVar51,s->buflen);
                  if (iVar26 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar51;
                    s->img_buffer_end = psVar35;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar51;
                    s->img_buffer_end = psVar51 + iVar26;
                  }
                  psVar36 = s->img_buffer;
                  goto LAB_00129586;
                }
                sVar8 = '\0';
              }
              puVar31[iVar20] = sVar8;
              bVar9 = 0xff;
              if (bVar67) {
                pbVar37 = s->img_buffer;
                if (s->img_buffer_end <= pbVar37) {
                  if (s->read_from_callbacks == 0) {
                    bVar9 = 0;
                    goto LAB_0012964b;
                  }
                  iVar26 = (*(s->io).read)(s->io_user_data,(char *)psVar51,s->buflen);
                  if (iVar26 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar51;
                    s->img_buffer_end = psVar35;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar51;
                    s->img_buffer_end = psVar51 + iVar26;
                  }
                  pbVar37 = s->img_buffer;
                }
                s->img_buffer = pbVar37 + 1;
                bVar9 = *pbVar37;
              }
LAB_0012964b:
              iVar26 = iVar20 + 3;
              if (iVar13 == 4) {
                puVar31[(long)iVar20 + 3] = bVar9;
                iVar26 = iVar20 + 4;
              }
              iVar20 = iVar26;
              local_4868 = local_4868 | bVar9;
              iVar25 = iVar25 + 1;
            } while (iVar25 < (int)s->img_x);
          }
          stbi__skip(s,uVar65);
          iVar25 = local_47c8 + 1;
        } while (iVar25 < (int)s->img_y);
      }
      bVar68 = true;
    }
    if (!bVar68) {
      return (uchar *)0x0;
    }
LAB_001299de:
    if (((iVar13 == 4) && (local_4868 == 0)) && (iVar62 = s->img_x * s->img_y * 4, -1 < iVar62 + -1)
       ) {
      lVar28 = (ulong)(iVar62 - 4) + 7;
      do {
        puVar31[lVar28 + 0xfffffffffffffffc] = 0xff;
        lVar28 = lVar28 + -4;
      } while (3 < lVar28);
    }
    if (0 < (int)sVar4) {
      uVar65 = (int)s->img_y >> 1;
      if (0 < (int)uVar65) {
        uVar18 = s->img_x * iVar13;
        uVar47 = (s->img_y - 1) * uVar18;
        uVar49 = 0;
        uVar46 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar58 = 0;
            do {
              uVar42 = puVar31[uVar58 + uVar49];
              puVar31[uVar58 + uVar49] = puVar31[uVar58 + uVar47];
              puVar31[uVar58 + uVar47] = uVar42;
              uVar58 = uVar58 + 1;
            } while (uVar18 != uVar58);
          }
          uVar46 = uVar46 + 1;
          uVar47 = uVar47 - uVar18;
          uVar49 = (ulong)((int)uVar49 + uVar18);
        } while (uVar46 != uVar65);
      }
    }
    if (((req_comp != 0) && (iVar13 != req_comp)) &&
       (puVar31 = stbi__convert_format(puVar31,iVar13,req_comp,s->img_x,s->img_y),
       puVar31 == (uchar *)0x0)) {
      return (uchar *)0x0;
    }
    *x = s->img_x;
    *y = s->img_y;
    if (comp != (int *)0x0) {
      *comp = s->img_n;
      return puVar31;
    }
    return puVar31;
  }
  if (s->img_buffer_original_end <= psVar35) {
    if (s->read_from_callbacks != 0) {
      psVar35 = s->buffer_start;
      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
      if (iVar13 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar35;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar35 + iVar13;
      }
      psVar35 = s->img_buffer;
      goto LAB_00128683;
    }
LAB_00129cba:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00129cca:
    iVar13 = stbi__psd_test(s);
    if (iVar13 != 0) {
      psVar35 = stbi__psd_load(s,x,y,comp,req_comp);
      return psVar35;
    }
    iVar13 = stbi__pic_test(s);
    if (iVar13 != 0) {
      psVar35 = stbi__pic_load(s,x,y,comp,req_comp);
      return psVar35;
    }
    iVar13 = stbi__pnm_test(s);
    if (iVar13 != 0) {
      psVar35 = stbi__pnm_load(s,x,y,comp,req_comp);
      return psVar35;
    }
    iVar13 = stbi__hdr_test(s);
    if (iVar13 == 0) {
      iVar13 = stbi__tga_test(s);
      if (iVar13 == 0) {
        stbi__g_failure_reason = "unknown image type";
        return (uchar *)0x0;
      }
      psVar35 = stbi__tga_load(s,x,y,comp,req_comp);
      return psVar35;
    }
    data_00 = stbi__hdr_load(s,x,y,comp,req_comp);
    if (req_comp == 0) {
      req_comp = *comp;
    }
    psVar35 = stbi__hdr_to_ldr(data_00,*x,*y,req_comp);
    return psVar35;
  }
LAB_00128683:
  s->img_buffer = psVar35 + 1;
  if (*psVar35 != 'G') goto LAB_00129cba;
  psVar35 = s->img_buffer;
  if (s->img_buffer_end <= psVar35) {
    if (s->read_from_callbacks == 0) goto LAB_00129cba;
    psVar35 = s->buffer_start;
    iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
    if (iVar13 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar35;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar35;
      s->img_buffer_end = psVar35 + iVar13;
    }
    psVar35 = s->img_buffer;
  }
  s->img_buffer = psVar35 + 1;
  if (*psVar35 != 'I') goto LAB_00129cba;
  psVar35 = s->img_buffer;
  if (s->img_buffer_end <= psVar35) {
    if (s->read_from_callbacks == 0) goto LAB_00129cba;
    psVar35 = s->buffer_start;
    iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
    if (iVar13 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar35;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar35;
      s->img_buffer_end = psVar35 + iVar13;
    }
    psVar35 = s->img_buffer;
  }
  s->img_buffer = psVar35 + 1;
  if (*psVar35 != 'F') goto LAB_00129cba;
  psVar35 = s->img_buffer;
  if (s->img_buffer_end <= psVar35) {
    if (s->read_from_callbacks == 0) goto LAB_00129cba;
    psVar35 = s->buffer_start;
    iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
    if (iVar13 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar35;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar35;
      s->img_buffer_end = psVar35 + iVar13;
    }
    psVar35 = s->img_buffer;
  }
  s->img_buffer = psVar35 + 1;
  if (*psVar35 != '8') goto LAB_00129cba;
  psVar35 = s->img_buffer;
  if (psVar35 < s->img_buffer_end) {
LAB_00129c53:
    s->img_buffer = psVar35 + 1;
    sVar8 = *psVar35;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar35 = s->buffer_start;
      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
      if (iVar13 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar35;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar35 + iVar13;
      }
      psVar35 = s->img_buffer;
      goto LAB_00129c53;
    }
    sVar8 = '\0';
  }
  if ((sVar8 != '9') && (sVar8 != '7')) goto LAB_00129cba;
  psVar35 = s->img_buffer;
  if (s->img_buffer_end <= psVar35) {
    if (s->read_from_callbacks == 0) goto LAB_00129cba;
    psVar35 = s->buffer_start;
    iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
    if (iVar13 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar35;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar35;
      s->img_buffer_end = psVar35 + iVar13;
    }
    psVar35 = s->img_buffer;
  }
  s->img_buffer = psVar35 + 1;
  sVar8 = *psVar35;
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar8 != 'a') goto LAB_00129cca;
  g = (stbi__gif *)malloc(0x4860);
  memset(g,0,0x4860);
  if ((g->out == (stbi_uc *)0x0) && (iVar13 = stbi__gif_header(s,g,comp,0), iVar13 == 0))
  goto LAB_0012a39d;
  psVar35 = g->out;
  lVar28 = (long)g->w * 4;
  __size = g->h * lVar28;
  psVar51 = (stbi_uc *)malloc(__size);
  g->out = psVar51;
  if (psVar51 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    goto LAB_0012a39d;
  }
  switch((uint)g->eflags >> 2 & 7) {
  case 0:
    iVar13 = 0;
    iVar62 = 0;
    iVar24 = (int)lVar28;
    iVar39 = (int)__size;
    goto LAB_00129f64;
  case 1:
    if (psVar35 != (stbi_uc *)0x0) {
      memcpy(psVar51,psVar35,__size);
    }
    g->old_out = psVar35;
    break;
  case 2:
    if (psVar35 != (stbi_uc *)0x0) {
      memcpy(psVar51,psVar35,__size);
    }
    iVar13 = g->start_x;
    iVar62 = g->start_y;
    iVar24 = g->max_x;
    iVar39 = g->max_y;
LAB_00129f64:
    stbi__fill_gif_background(g,iVar13,iVar62,iVar24,iVar39);
    break;
  case 3:
    if (g->old_out != (stbi_uc *)0x0) {
      for (iVar13 = g->start_y; iVar13 < g->max_y; iVar13 = iVar13 + g->w * 4) {
        lVar28 = (long)g->start_x + (long)iVar13;
        memcpy(g->out + lVar28,g->old_out + lVar28,(long)g->max_x - (long)g->start_x);
      }
    }
  }
  psVar35 = s->buffer_start;
  psVar51 = s->buffer_start + 1;
LAB_00129fdb:
  psVar36 = s->img_buffer;
  if (psVar36 < s->img_buffer_end) {
LAB_0012a04d:
    s->img_buffer = psVar36 + 1;
    sVar8 = *psVar36;
  }
  else {
    if (s->read_from_callbacks != 0) {
      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
      if (iVar13 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar51;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar35 + iVar13;
      }
      psVar36 = s->img_buffer;
      goto LAB_0012a04d;
    }
    sVar8 = '\0';
  }
  if (sVar8 == '!') {
    psVar36 = s->img_buffer;
    if (s->img_buffer_end <= psVar36) {
      if (s->read_from_callbacks == 0) goto LAB_0012a2b0;
      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
      if (iVar13 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar51;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar35;
        s->img_buffer_end = psVar35 + iVar13;
      }
      psVar36 = s->img_buffer;
    }
    s->img_buffer = psVar36 + 1;
    if (*psVar36 != 0xf9) goto LAB_0012a2b0;
    pbVar37 = s->img_buffer;
    if (pbVar37 < s->img_buffer_end) {
LAB_0012a15c:
      s->img_buffer = pbVar37 + 1;
      bVar9 = *pbVar37;
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
        if (iVar13 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar35;
          s->img_buffer_end = psVar51;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar35;
          s->img_buffer_end = psVar35 + iVar13;
        }
        pbVar37 = s->img_buffer;
        goto LAB_0012a15c;
      }
      bVar9 = 0;
    }
    if (bVar9 == 4) {
      pbVar37 = s->img_buffer;
      if (pbVar37 < s->img_buffer_end) {
LAB_0012a1f5:
        s->img_buffer = pbVar37 + 1;
        uVar65 = (uint)*pbVar37;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
          if (iVar13 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar35;
            s->img_buffer_end = psVar51;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar35;
            s->img_buffer_end = psVar35 + iVar13;
          }
          pbVar37 = s->img_buffer;
          goto LAB_0012a1f5;
        }
        uVar65 = 0;
      }
      g->eflags = uVar65;
      iVar13 = stbi__get16le(s);
      g->delay = iVar13;
      pbVar37 = s->img_buffer;
      if (pbVar37 < s->img_buffer_end) {
LAB_0012a28b:
        s->img_buffer = pbVar37 + 1;
        uVar65 = (uint)*pbVar37;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
          if (iVar13 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar35;
            s->img_buffer_end = psVar51;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar35;
            s->img_buffer_end = psVar35 + iVar13;
          }
          pbVar37 = s->img_buffer;
          goto LAB_0012a28b;
        }
        uVar65 = 0;
      }
      g->transparent = uVar65;
LAB_0012a2b0:
      do {
        pbVar37 = s->img_buffer;
        if (pbVar37 < s->img_buffer_end) {
LAB_0012a322:
          s->img_buffer = pbVar37 + 1;
          bVar9 = *pbVar37;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
            if (iVar13 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar51;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar35 + iVar13;
            }
            pbVar37 = s->img_buffer;
            goto LAB_0012a322;
          }
          bVar9 = 0;
        }
        if (bVar9 == 0) goto LAB_00129fdb;
        stbi__skip(s,(uint)bVar9);
      } while( true );
    }
    stbi__skip(s,(uint)bVar9);
    goto LAB_00129fdb;
  }
  psVar52 = s;
  if (sVar8 != ';') {
    if (sVar8 == ',') {
      iVar13 = stbi__get16le(s);
      iVar62 = stbi__get16le(s);
      iVar24 = stbi__get16le(s);
      iVar39 = stbi__get16le(s);
      if ((g->w < iVar24 + iVar13) || (g->h < iVar39 + iVar62)) {
        stbi__g_failure_reason = "bad Image Descriptor";
      }
      else {
        iVar25 = g->w * 4;
        g->line_size = iVar25;
        g->start_x = iVar13 << 2;
        g->start_y = iVar62 * iVar25;
        g->max_x = (iVar24 + iVar13) * 4;
        g->max_y = iVar25 * (iVar39 + iVar62);
        g->cur_x = iVar13 << 2;
        g->cur_y = iVar62 * iVar25;
        pbVar37 = s->img_buffer;
        if (pbVar37 < s->img_buffer_end) {
LAB_0012a4df:
          s->img_buffer = pbVar37 + 1;
          bVar9 = *pbVar37;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
            if (iVar13 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar51;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar35 + iVar13;
            }
            pbVar37 = s->img_buffer;
            goto LAB_0012a4df;
          }
          bVar9 = 0;
        }
        g->lflags = (uint)bVar9;
        iVar13 = g->line_size * 8;
        if ((bVar9 & 0x40) == 0) {
          iVar13 = g->line_size;
        }
        g->step = iVar13;
        g->parse = (int)((uint)bVar9 << 0x19) >> 0x1f & 3;
        if ((char)bVar9 < '\0') {
          pal = g->lpal;
          local_4860 = 0xffffffff;
          iVar13 = -1;
          if ((g->eflags & 1) != 0) {
            iVar13 = g->transparent;
          }
          stbi__gif_parse_colortable(s,pal,2 << (bVar9 & 7),iVar13);
        }
        else {
          if ((g->flags & 0x80) == 0) {
            stbi__g_failure_reason = "missing color table";
            goto LAB_0012a39d;
          }
          lVar28 = (long)g->transparent;
          local_4860 = 0xffffffff;
          if ((-1 < lVar28) && ((g->eflags & 1) != 0)) {
            local_4860 = (uint)g->pal[lVar28][3];
            g->pal[lVar28][3] = '\0';
          }
          pal = g->pal;
        }
        g->color_table = *pal;
        pbVar37 = s->img_buffer;
        if (pbVar37 < s->img_buffer_end) {
LAB_0012a62d:
          s->img_buffer = pbVar37 + 1;
          bVar9 = *pbVar37;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
            if (iVar13 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar51;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar35;
              s->img_buffer_end = psVar35 + iVar13;
            }
            pbVar37 = s->img_buffer;
            goto LAB_0012a62d;
          }
          bVar9 = 0;
        }
        if (bVar9 < 0xd) {
          uVar65 = 1 << (bVar9 & 0x1f);
          uVar49 = 0;
          do {
            g->codes[uVar49].prefix = -1;
            g->codes[uVar49].first = (stbi_uc)uVar49;
            g->codes[uVar49].suffix = (stbi_uc)uVar49;
            uVar49 = uVar49 + 1;
          } while (uVar65 != uVar49);
          uVar27 = (2 << (bVar9 & 0x1f)) - 1;
          uVar53 = 0;
          iVar62 = 0;
          uVar44 = 0;
          local_4850 = uVar27;
          uVar47 = uVar65 + 2;
          bVar68 = true;
          uVar18 = 0xffffffff;
          iVar13 = bVar9 + 1;
LAB_0012a6e8:
          do {
            iVar24 = iVar62 - iVar13;
            if (iVar13 <= iVar62) {
              bVar38 = (byte)iVar13;
              uVar66 = uVar44 & local_4850;
              bVar67 = true;
              bVar6 = false;
              if (uVar66 == uVar65) {
                uVar66 = 0xffffffff;
                local_4850 = uVar27;
                iVar13 = bVar9 + 1;
                uVar47 = uVar65 + 2;
              }
              else {
                if (uVar66 == uVar65 + 1) {
                  do {
                    stbi__skip(s,uVar53);
                    pbVar37 = s->img_buffer;
                    if (pbVar37 < s->img_buffer_end) {
LAB_0012a90e:
                      s->img_buffer = pbVar37 + 1;
                      bVar12 = *pbVar37;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                        if (iVar62 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar35;
                          s->img_buffer_end = psVar51;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar35;
                          s->img_buffer_end = psVar35 + iVar62;
                        }
                        pbVar37 = s->img_buffer;
                        goto LAB_0012a90e;
                      }
                      bVar12 = 0;
                    }
                    if (bVar12 == 0) goto LAB_0012a950;
                    uVar53 = (uint)bVar12;
                  } while( true );
                }
                if ((int)uVar47 < (int)uVar66) {
                  stbi__g_failure_reason = "illegal code in raster";
                }
                else if (bVar68) {
                  stbi__g_failure_reason = "no clear code";
                  bVar68 = true;
                }
                else {
                  if ((int)uVar18 < 0) {
                    if (uVar66 != uVar47) goto LAB_0012aa7e;
                    stbi__g_failure_reason = "illegal code in raster";
                  }
                  else {
                    uVar40 = uVar47 + 1;
                    if ((int)uVar47 < 0x1000) {
                      g->codes[(int)uVar47].prefix = (stbi__int16)uVar18;
                      sVar8 = g->codes[uVar18].first;
                      g->codes[(int)uVar47].first = sVar8;
                      if (uVar66 != uVar40) {
                        sVar8 = g->codes[(int)uVar66].first;
                      }
                      g->codes[(int)uVar47].suffix = sVar8;
                      uVar47 = uVar40;
LAB_0012aa7e:
                      stbi__out_gif_code(g,(stbi__uint16)uVar66);
                      bVar68 = (uVar47 & local_4850) == 0;
                      iVar62 = iVar13 + 1;
                      if ((int)uVar47 < 0x1000 && bVar68) {
                        iVar13 = iVar62;
                      }
                      if ((int)uVar47 < 0x1000 && bVar68) {
                        local_4850 = ~(-1 << ((byte)iVar62 & 0x1f));
                      }
                      goto LAB_0012a9aa;
                    }
                    stbi__g_failure_reason = "too many codes";
                    uVar47 = uVar40;
                  }
                  bVar68 = false;
                }
                bVar67 = false;
                local_48a0 = (stbi__context *)0x0;
                uVar66 = uVar18;
                bVar6 = bVar68;
              }
              goto LAB_0012a9aa;
            }
            if (uVar53 == 0) {
              pbVar37 = s->img_buffer;
              if (pbVar37 < s->img_buffer_end) {
LAB_0012a773:
                s->img_buffer = pbVar37 + 1;
                bVar38 = *pbVar37;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar24 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                  if (iVar24 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar35;
                    s->img_buffer_end = psVar51;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar35;
                    s->img_buffer_end = psVar35 + iVar24;
                  }
                  pbVar37 = s->img_buffer;
                  goto LAB_0012a773;
                }
                bVar38 = 0;
              }
              if (bVar38 == 0) {
                local_48a0 = (stbi__context *)g->out;
                goto LAB_0012aade;
              }
              uVar53 = (uint)bVar38;
            }
            pbVar37 = s->img_buffer;
            if (pbVar37 < s->img_buffer_end) {
LAB_0012a809:
              s->img_buffer = pbVar37 + 1;
              uVar66 = (uint)*pbVar37;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar24 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                if (iVar24 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar35;
                  s->img_buffer_end = psVar51;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar35;
                  s->img_buffer_end = psVar35 + iVar24;
                }
                pbVar37 = s->img_buffer;
                goto LAB_0012a809;
              }
              uVar66 = 0;
            }
            bVar38 = (byte)iVar62;
            uVar53 = uVar53 - 1;
            iVar62 = iVar62 + 8;
            uVar44 = uVar44 | uVar66 << (bVar38 & 0x1f);
          } while( true );
        }
        local_48a0 = (stbi__context *)0x0;
LAB_0012aade:
        if (local_48a0 != (stbi__context *)0x0) {
          psVar52 = local_48a0;
          if (local_4860 != 0xffffffff) {
            g->pal[g->transparent][3] = (stbi_uc)local_4860;
          }
          goto LAB_0012a3b9;
        }
      }
LAB_0012a39d:
      psVar52 = (stbi__context *)0x0;
    }
    else {
      stbi__g_failure_reason = "unknown code";
      psVar52 = (stbi__context *)0x0;
    }
  }
LAB_0012a3b9:
  data = (stbi__context *)0x0;
  if (psVar52 != s) {
    data = psVar52;
  }
  if (data == (stbi__context *)0x0) {
    if (g->out != (stbi_uc *)0x0) {
      free(g->out);
    }
    data = (stbi__context *)0x0;
  }
  else {
    uVar65 = g->w;
    *x = uVar65;
    uVar47 = g->h;
    *y = uVar47;
    if ((req_comp & 0xfffffffbU) != 0) {
      data = (stbi__context *)stbi__convert_format((uchar *)data,4,req_comp,uVar65,uVar47);
    }
  }
LAB_00128f02:
  free(g);
  return (uchar *)data;
LAB_00127ce9:
  iVar24 = iVar24 + 1;
  bVar68 = iVar24 < unaff_RBP->v;
  if (unaff_RBP->v <= iVar24) goto LAB_00127d07;
  goto LAB_00127c8c;
LAB_0012a950:
  local_48a0 = (stbi__context *)g->out;
  uVar53 = 0;
  bVar67 = false;
  uVar66 = uVar18;
  bVar6 = bVar68;
LAB_0012a9aa:
  iVar62 = iVar24;
  uVar44 = (int)uVar44 >> (bVar38 & 0x1f);
  bVar68 = bVar6;
  uVar18 = uVar66;
  if (!bVar67) goto LAB_0012aade;
  goto LAB_0012a6e8;
}

Assistant:

static unsigned char *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}